

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1P3L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float *pfVar1;
  float *this;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_00;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_01;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_02;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_03;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_04;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_05;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_06;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_07;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_08;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_09;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_10;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_11;
  Matrix<float,3,1,0,3,1> *this_12;
  Matrix<float,3,1,0,3,1> *other;
  Matrix<float,3,1,0,3,1> *other_00;
  Matrix<float,3,1,0,3,1> *this_13;
  Matrix<float,3,1,0,3,1> *other_01;
  Matrix<float,3,1,0,3,1> *other_02;
  Matrix<float,3,1,0,3,1> *other_03;
  Matrix<float,3,1,0,3,1> *other_04;
  Matrix<float,3,1,0,3,1> *other_05;
  Matrix<float,3,1,0,3,1> *other_06;
  Matrix<float,3,1,0,3,1> *other_07;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *this_14;
  Matrix<float,3,1,0,3,1> *this_15;
  DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *pDVar2;
  DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *pDVar3;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *this_16;
  pointer *this_17;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  size_type sVar28;
  ostream *poVar29;
  reference pvVar30;
  reference pvVar31;
  Scalar *pSVar32;
  reference pvVar33;
  Scalar *pSVar34;
  Scalar *pSVar35;
  void *this_18;
  reference pvVar36;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  float fVar449;
  float fVar450;
  float fVar451;
  float fVar452;
  float fVar453;
  float fVar454;
  float fVar455;
  float fVar456;
  float fVar457;
  float fVar458;
  float fVar459;
  float fVar460;
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar464;
  float fVar465;
  float fVar466;
  float fVar467;
  float fVar468;
  float fVar469;
  float fVar470;
  float fVar471;
  float fVar472;
  float fVar473;
  float fVar474;
  float fVar475;
  float fVar476;
  float fVar477;
  float fVar478;
  float fVar479;
  float fVar480;
  float fVar481;
  float fVar482;
  float fVar483;
  float fVar484;
  float fVar485;
  float fVar486;
  float fVar487;
  float fVar488;
  float fVar489;
  float fVar490;
  float fVar491;
  float fVar492;
  float fVar493;
  float fVar494;
  float fVar495;
  float fVar496;
  float fVar497;
  float fVar498;
  float fVar499;
  float fVar500;
  float fVar501;
  float fVar502;
  float fVar503;
  float fVar504;
  float fVar505;
  float fVar506;
  float fVar507;
  float fVar508;
  float fVar509;
  float fVar510;
  float fVar511;
  float fVar512;
  float fVar513;
  float fVar514;
  float fVar515;
  float fVar516;
  float fVar517;
  float fVar518;
  float fVar519;
  float fVar520;
  float fVar521;
  float fVar522;
  float fVar523;
  float fVar524;
  float fVar525;
  float fVar526;
  float fVar527;
  float fVar528;
  float fVar529;
  float fVar530;
  float fVar531;
  float fVar532;
  float fVar533;
  float fVar534;
  float fVar535;
  float fVar536;
  float fVar537;
  float fVar538;
  float fVar539;
  float fVar540;
  float fVar541;
  float fVar542;
  float fVar543;
  float fVar544;
  float fVar545;
  float fVar546;
  float fVar547;
  float fVar548;
  float fVar549;
  float fVar550;
  float fVar551;
  float fVar552;
  float fVar553;
  float fVar554;
  float fVar555;
  float fVar556;
  float fVar557;
  float fVar558;
  float fVar559;
  float fVar560;
  float fVar561;
  float fVar562;
  float fVar563;
  float fVar564;
  float fVar565;
  float fVar566;
  float fVar567;
  float fVar568;
  float fVar569;
  float fVar570;
  float fVar571;
  float fVar572;
  float fVar573;
  float fVar574;
  float fVar575;
  float fVar576;
  float fVar577;
  float fVar578;
  float fVar579;
  float fVar580;
  float fVar581;
  float fVar582;
  float fVar583;
  float fVar584;
  float fVar585;
  float fVar586;
  float fVar587;
  float fVar588;
  float fVar589;
  float fVar590;
  float fVar591;
  float fVar592;
  float fVar593;
  float fVar594;
  float fVar595;
  float fVar596;
  float fVar597;
  float fVar598;
  float fVar599;
  float fVar600;
  float fVar601;
  float fVar602;
  float fVar603;
  float fVar604;
  float fVar605;
  float fVar606;
  float fVar607;
  float fVar608;
  float fVar609;
  float fVar610;
  float fVar611;
  float fVar612;
  float fVar613;
  float fVar614;
  float fVar615;
  float fVar616;
  float fVar617;
  float fVar618;
  float fVar619;
  float fVar620;
  float fVar621;
  float fVar622;
  float fVar623;
  float fVar624;
  float fVar625;
  float fVar626;
  float fVar627;
  float fVar628;
  float fVar629;
  float fVar630;
  float fVar631;
  float fVar632;
  float fVar633;
  float fVar634;
  float fVar635;
  float fVar636;
  float fVar637;
  float fVar638;
  float fVar639;
  float fVar640;
  float fVar641;
  float fVar642;
  float fVar643;
  float fVar644;
  float fVar645;
  float fVar646;
  float fVar647;
  float fVar648;
  float fVar649;
  float fVar650;
  float fVar651;
  float fVar652;
  float fVar653;
  float fVar654;
  float fVar655;
  float fVar656;
  float fVar657;
  float fVar658;
  float fVar659;
  float fVar660;
  float fVar661;
  float fVar662;
  float fVar663;
  float fVar664;
  float fVar665;
  float fVar666;
  float fVar667;
  float fVar668;
  float fVar669;
  float fVar670;
  float fVar671;
  float fVar672;
  float fVar673;
  float fVar674;
  float fVar675;
  float fVar676;
  float fVar677;
  float fVar678;
  float fVar679;
  float fVar680;
  float fVar681;
  float fVar682;
  float fVar683;
  float fVar684;
  float fVar685;
  float fVar686;
  float fVar687;
  float fVar688;
  float fVar689;
  float fVar690;
  float fVar691;
  float fVar692;
  float fVar693;
  float fVar694;
  float fVar695;
  float fVar696;
  float fVar697;
  float fVar698;
  float fVar699;
  float fVar700;
  float fVar701;
  float fVar702;
  float fVar703;
  float fVar704;
  float fVar705;
  float fVar706;
  float fVar707;
  float fVar708;
  float fVar709;
  float fVar710;
  float fVar711;
  float fVar712;
  float fVar713;
  float fVar714;
  float fVar715;
  float fVar716;
  float fVar717;
  float fVar718;
  float fVar719;
  float fVar720;
  float fVar721;
  float fVar722;
  float fVar723;
  float fVar724;
  float fVar725;
  float fVar726;
  float fVar727;
  float fVar728;
  float fVar729;
  float fVar730;
  float fVar731;
  float fVar732;
  float fVar733;
  float fVar734;
  float fVar735;
  float fVar736;
  float fVar737;
  float fVar738;
  float fVar739;
  float fVar740;
  float fVar741;
  float fVar742;
  float fVar743;
  float fVar744;
  float fVar745;
  float fVar746;
  float fVar747;
  float fVar748;
  float fVar749;
  float fVar750;
  float fVar751;
  float fVar752;
  float fVar753;
  float fVar754;
  float fVar755;
  float fVar756;
  float fVar757;
  float fVar758;
  float fVar759;
  float fVar760;
  float fVar761;
  float fVar762;
  float fVar763;
  float fVar764;
  float fVar765;
  float fVar766;
  float fVar767;
  float fVar768;
  float fVar769;
  float fVar770;
  float fVar771;
  float fVar772;
  float fVar773;
  float fVar774;
  float fVar775;
  float fVar776;
  float fVar777;
  float fVar778;
  float fVar779;
  float fVar780;
  float fVar781;
  float fVar782;
  float fVar783;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> PVar784;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  PVar785;
  XprTypeNested local_1798;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_1790;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_1780;
  Scalar local_1764;
  Scalar local_1760;
  Scalar local_175c;
  Scalar local_1758;
  Scalar local_1754;
  Scalar local_1750;
  Scalar local_174c;
  Scalar local_1748;
  Scalar local_1744;
  Scalar local_1740;
  float local_173c;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> local_1738;
  uint local_1714;
  uint local_1710;
  uint iter;
  uint numSolutions;
  Matrix<float,_4,_4,_0,_4,_4> transOut;
  float shouldBeZero2;
  float shouldBeZero1;
  float b;
  float a;
  float ty;
  float tx;
  float sTheta2;
  float sTheta1;
  float s;
  vector<float,_std::allocator<float>_> realRoots;
  Matrix<float,_5,_1,_0,_5,_1> factors;
  float c5;
  float c4;
  float c3;
  float c2;
  float c1;
  RhsNested local_1650;
  float local_1648;
  float local_1644;
  float v36;
  float v35;
  float v34;
  float v33;
  float v32;
  float v31;
  Matrix<float,_6,_1,_0,_6,_1> v3;
  float u36;
  float u35;
  float u34;
  float u33;
  float u32;
  float u31;
  Matrix<float,_6,_1,_0,_6,_1> u3;
  float v26;
  float v25;
  float v24;
  float v23;
  float v22;
  float v21;
  Matrix<float,_6,_1,_0,_6,_1> v2;
  float u26;
  float u25;
  float u24;
  float u23;
  float u22;
  float u21;
  Matrix<float,_6,_1,_0,_6,_1> u2;
  float v16;
  float v15;
  float v14;
  float v13;
  float v12;
  float v11;
  Matrix<float,_6,_1,_0,_6,_1> v1;
  float u16;
  float u15;
  float u14;
  float u13;
  float u12;
  float u11;
  Matrix<float,_6,_1,_0,_6,_1> u1;
  Type local_14a0;
  ColXpr local_1468;
  Type local_1438;
  Matrix<float,_3,_1,_0,_3,_1> local_13d4;
  Matrix<float,_3,_3,_0,_3,_3> local_13c8;
  int local_13a4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_13a0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1380;
  Type local_1328;
  Type local_12f0;
  Type local_12b8;
  Type local_1280;
  ConstantReturnType local_1248;
  Type local_1240;
  Type local_1208;
  ColXpr local_11d0;
  Type local_11a0;
  Matrix<float,_3,_1,_0,_3,_1> local_113c;
  Matrix<float,_3,_3,_0,_3,_3> local_1130;
  int local_110c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_1108;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_10e8;
  Type local_1090;
  Type local_1058;
  Type local_1020;
  Type local_fe8;
  ConstantReturnType local_fb0;
  undefined1 local_fa8 [8];
  Matrix<float,_6,_6,_0,_6,_6> TK;
  Matrix<float,_6,_6,_0,_6,_6> TL;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  undefined1 local_e38 [8];
  Matrix<float,_4,_4,_0,_4,_4> TV;
  Matrix<float,_4,_1,_0,_4,_1> local_de8;
  undefined1 local_dd8 [8];
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  predTrans;
  RealScalar local_d84;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_d80 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_d44 [12];
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_d38 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_d00;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_ce8 [60];
  RealScalar local_cac;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_ca8 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_c6c [12];
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_c60 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_c28;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_c10 [60];
  RealScalar local_bd4;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_bd0 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_b94 [12];
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_b88 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_b50;
  DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_b38 [8];
  Matrix<float,_6,_1,_0,_6,_1> L32;
  Matrix<float,_6,_1,_0,_6,_1> L22;
  Matrix<float,_6,_1,_0,_6,_1> L12;
  RealScalar local_ab4;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_ab0 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_a74 [12];
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_a68 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_a30;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_a18 [60];
  RealScalar local_9dc;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_9d8 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_99c [12];
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_990 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_958;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_940 [60];
  RealScalar local_904;
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_900 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_8c4 [12];
  Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> local_8b8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_880;
  DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_864 [8];
  Matrix<float,_6,_1,_0,_6,_1> L31;
  Matrix<float,_6,_1,_0,_6,_1> L21;
  Matrix<float,_6,_1,_0,_6,_1> L11;
  Matrix<float,_3,_1,_0,_3,_1> D1;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_7d8;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_788 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_750;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_700 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_6c8;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_678 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_640;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_5f0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_5b8;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_568 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_530;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_4e0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_4a8;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_458 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_420;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_3d0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_398;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_348 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_310;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_2c0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_288;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> local_238 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_200;
  Matrix<float,3,1,0,3,1> local_1ac [8];
  Matrix<float,_3,_1,_0,_3,_1> tQ32;
  Matrix<float,_3,_1,_0,_3,_1> tQ31;
  Matrix<float,_3,_1,_0,_3,_1> tP32;
  Matrix<float,_3,_1,_0,_3,_1> tP31;
  Matrix<float,_3,_1,_0,_3,_1> tQ22;
  Matrix<float,_3,_1,_0,_3,_1> tQ21;
  Matrix<float,_3,_1,_0,_3,_1> tP22;
  Matrix<float,_3,_1,_0,_3,_1> tP21;
  Matrix<float,_3,_1,_0,_3,_1> tQ12;
  Matrix<float,_3,_1,_0,_3,_1> tQ11;
  Matrix<float,_3,_1,_0,_3,_1> tP12;
  Matrix<float,_3,_1,_0,_3,_1> tP11;
  bool verbose;
  Matrix<float,_4,_1,_0,_4,_1> Q32;
  Matrix<float,_4,_1,_0,_4,_1> Q31;
  Matrix<float,_4,_1,_0,_4,_1> P32;
  Matrix<float,_4,_1,_0,_4,_1> P31;
  Matrix<float,_4,_1,_0,_4,_1> Q22;
  Matrix<float,_4,_1,_0,_4,_1> Q21;
  Matrix<float,_4,_1,_0,_4,_1> P22;
  Matrix<float,_4,_1,_0,_4,_1> P21;
  Matrix<float,_4,_1,_0,_4,_1> Q12;
  Matrix<float,_4,_1,_0,_4,_1> Q11;
  Matrix<float,_4,_1,_0,_4,_1> P12;
  Matrix<float,_4,_1,_0,_4,_1> P11;
  Matrix<float,_4,_1,_0,_4,_1> Nu;
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar28 = std::
           vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
           ::size(plPair);
  if ((sVar28 != 0) &&
     (sVar28 = std::
               vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
               ::size(lPair), 2 < sVar28)) {
    pfVar1 = Nu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
             2;
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)pfVar1);
    this = P11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
           2;
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this);
    this_00 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (P12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_00);
    this_01 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_01);
    this_02 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_02);
    this_03 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (P21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_03);
    this_04 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (P22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_04);
    this_05 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_05);
    this_06 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_06);
    this_07 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (P31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_07);
    this_08 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (P32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_08);
    this_09 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_09);
    this_10 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_10);
    this_11 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              (tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_11);
    pvVar30 = std::
              vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
              ::operator[](plPair,0);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)pfVar1,&pvVar30->first);
    pvVar30 = std::
              vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
              ::operator[](plPair,0);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this,&pvVar30->second);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_00,(Matrix<float,_4,_1,_0,_4,_1> *)pvVar31);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_01,&(pvVar31->first).second);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_02,&(pvVar31->second).first);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_03,&(pvVar31->second).second);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_04,(Matrix<float,_4,_1,_0,_4,_1> *)pvVar31);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_05,&(pvVar31->first).second);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_06,&(pvVar31->second).first);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_07,&(pvVar31->second).second);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_08,(Matrix<float,_4,_1,_0,_4,_1> *)pvVar31);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_09,&(pvVar31->first).second);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_10,&(pvVar31->second).first);
    pvVar31 = std::
              vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)this_11,&(pvVar31->second).second);
    tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._3_1_
         = 0;
    this_12 = (Matrix<float,3,1,0,3,1> *)
              (tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)this_12);
    other = (Matrix<float,3,1,0,3,1> *)
            (tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other);
    other_00 = (Matrix<float,3,1,0,3,1> *)
               (tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_00);
    this_13 = (Matrix<float,3,1,0,3,1> *)
              (tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)this_13);
    other_01 = (Matrix<float,3,1,0,3,1> *)
               (tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_01);
    other_02 = (Matrix<float,3,1,0,3,1> *)
               (tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_02);
    other_03 = (Matrix<float,3,1,0,3,1> *)
               (tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_03);
    other_04 = (Matrix<float,3,1,0,3,1> *)
               (tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_04);
    other_05 = (Matrix<float,3,1,0,3,1> *)
               (tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_05);
    other_06 = (Matrix<float,3,1,0,3,1> *)
               (tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_06);
    other_07 = (Matrix<float,3,1,0,3,1> *)
               (tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)other_07);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_1ac);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_238,this_00,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_00,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_200,local_238,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_12,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                        *)&local_200);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_2c0,this_01,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_01,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_288,local_2c0,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                      *)&local_288);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_348,this_02,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_02,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_310,local_348,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_00,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_310);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_3d0,this_03,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_03,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_398,local_3d0,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_13,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                        *)&local_398);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_458,this_04,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_04,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_420,local_458,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_01,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_420);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_4e0,this_05,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_05,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_4a8,local_4e0,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_02,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_4a8);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_568,this_06,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_06,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_530,local_568,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_03,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_530);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_5f0,this_07,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_07,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_5b8,local_5f0,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_04,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_5b8);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_678,this_08,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_08,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_640,local_678,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_05,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_640);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_700,this_09,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_09,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_6c8,local_700,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_06,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_6c8);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_788,this_10,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_10,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_750,local_788,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (other_07,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_750);
    this_14 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)
              (D1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              + 1);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)this_14,this_11,3);
    pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)this_11,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_7d8,this_14,pSVar32);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (local_1ac,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                *)&local_7d8);
    this_15 = (Matrix<float,3,1,0,3,1> *)
              (L11.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array + 4);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)this_15);
    pDVar2 = (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4);
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)pDVar2);
    pDVar3 = (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4);
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)pDVar3);
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_864);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_880,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)other,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_12);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_15,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        *)&local_880);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_8b8,pDVar2,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_8b8,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_15);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_8c4,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_900,pDVar2,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_900,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_8c4);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_940,pDVar2,3);
    local_904 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_940);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=(pDVar2,&local_904);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_958,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)other_02,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_01);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_15,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        *)&local_958);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_990,pDVar3,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_990,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_15);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_99c,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_02);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_9d8,pDVar3,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_9d8,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_99c);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_a18,pDVar3,3);
    local_9dc = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_a18);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=(pDVar3,&local_9dc);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_a30,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)other_06,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_05);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_15,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        *)&local_a30);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_a68,local_864,3)
    ;
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_a68,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_15);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_a74,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_06);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_ab0,local_864,3)
    ;
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_ab0,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a74);
    this_16 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
              (L12.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array + 4);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)this_16,local_864,3);
    local_ab4 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(this_16);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=(local_864,&local_ab4);
    pDVar2 = (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4);
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)pDVar2);
    pDVar3 = (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4);
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)pDVar3);
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_b38);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_b50,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)this_13,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_00);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_15,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        *)&local_b50);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_b88,pDVar2,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_b88,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_15);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_b94,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_13);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_bd0,pDVar2,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_bd0,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_b94);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_c10,pDVar2,3);
    local_bd4 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_c10);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=(pDVar2,&local_bd4);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_c28,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)other_04,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_03);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_15,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        *)&local_c28);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_c60,pDVar3,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_c60,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_15);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_c6c,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_04);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_ca8,pDVar3,3);
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_ca8,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_c6c);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_ce8,pDVar3,3);
    local_cac = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_ce8);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=(pDVar3,&local_cac);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_d00,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_1ac,
               (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other_07);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (this_15,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        *)&local_d00);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_d38,local_b38,3)
    ;
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_d38,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_15);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_d44,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_1ac);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_d80,local_b38,3)
    ;
    Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
              (local_d80,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_d44);
    this_17 = &predTrans.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>((Type *)this_17,local_b38,3);
    local_d84 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)this_17);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=(local_b38,&local_d84);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix(&local_de8,(Matrix<float,_4,_1,_0,_4,_1> *)pfVar1);
    pfVar1 = TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
             0xe;
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
              ((Matrix<float,_4,_1,_0,_4,_1> *)pfVar1,(Matrix<float,_4,_1,_0,_4,_1> *)this);
    getPredefinedTransformations1Plane3Line<float>
              ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)local_dd8,&local_de8,(Matrix<float,_4,_1,_0,_4,_1> *)pfVar1,false);
    pvVar33 = std::
              vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                      *)local_dd8);
    Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_e38,pvVar33);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)local_dd8);
    pvVar33 = std::
              vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                      *)local_dd8);
    Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<float,_4,_4,_0,_4,_4> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),pvVar33);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)local_dd8);
    if ((tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
         _3_1_ & 1) != 0) {
      poVar29 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix TU");
      poVar29 = (ostream *)std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
      poVar29 = Eigen::operator<<(poVar29,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                          (TL.
                                           super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                           .m_storage.m_data.array + 0x22));
      std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
    }
    if ((tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
         _3_1_ & 1) != 0) {
      poVar29 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix TV");
      poVar29 = (ostream *)std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
      poVar29 = Eigen::operator<<(poVar29,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                          local_e38);
      std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
    }
    Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix
              ((Matrix<float,_6,_6,_0,_6,_6> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22));
    Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix((Matrix<float,_6,_6,_0,_6,_6> *)local_fa8);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Zero(&local_fb0,6,6);
    Eigen::Matrix<float,6,6,0,6,6>::operator=
              ((Matrix<float,6,6,0,6,6> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
                *)&local_fb0);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_fe8,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_1020,
               (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_1020,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_fe8);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1058,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              (&local_1090,
               (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_1090,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_1058);
    local_110c = -1;
    Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::col
              (&local_11d0,
               (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              (&local_11a0,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               &local_11d0,3);
    Eigen::Matrix<float,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((Matrix<float,3,1,0,3,1> *)&local_113c,
               (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&local_11a0);
    getSkew<float>(&local_1130,&local_113c);
    Eigen::operator*(&local_1108,&local_110c,(StorageBaseType *)&local_1130);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1208,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
    ::operator*(&local_10e8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                 *)&local_1108,
                (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_1208);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
              (&local_1240,
               (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_1240,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_10e8);
    if ((tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
         _3_1_ & 1) != 0) {
      poVar29 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix TL");
      poVar29 = (ostream *)std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
      poVar29 = Eigen::operator<<(poVar29,(DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                                          (TK.
                                           super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                           .m_storage.m_data.array + 0x22));
      std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
    }
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Zero(&local_1248,6,6);
    Eigen::Matrix<float,6,6,0,6,6>::operator=
              ((Matrix<float,6,6,0,6,6> *)local_fa8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
                *)&local_1248);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1280,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_e38,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_12b8,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fa8,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_12b8,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_1280);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_12f0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_e38,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              (&local_1328,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fa8,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_1328,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_12f0);
    local_13a4 = -1;
    Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::col
              (&local_1468,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_e38,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              (&local_1438,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               &local_1468,3);
    Eigen::Matrix<float,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((Matrix<float,3,1,0,3,1> *)&local_13d4,
               (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&local_1438);
    getSkew<float>(&local_13c8,&local_13d4);
    Eigen::operator*(&local_13a0,&local_13a4,(StorageBaseType *)&local_13c8);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_14a0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_e38,3,3);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
    ::operator*(&local_1380,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                 *)&local_13a0,
                (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_14a0);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + 4),(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fa8,3,3
              );
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
               (u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 4),
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_1380);
    if ((tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
         _3_1_ & 1) != 0) {
      poVar29 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix TK");
      poVar29 = (ostream *)std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
      poVar29 = Eigen::operator<<(poVar29,(DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                                          local_fa8);
      std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
    }
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)&u12);
    PVar784 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                         (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array + 0x22),
                         (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                         (L21.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + 4));
    v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
         PVar784.m_lhs;
    Eigen::Matrix<float,6,1,0,6,1>::operator=
              ((Matrix<float,6,1,0,6,1> *)&u12,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)(v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 4));
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u12,0);
    fVar4 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u12,1);
    fVar5 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u12,2);
    fVar6 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u12,3);
    fVar7 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u12,4);
    fVar8 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u12,5);
    fVar9 = *pSVar34;
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)&v12);
    PVar784 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fa8,
                         (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                         (L22.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + 4));
    u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
         PVar784.m_lhs;
    Eigen::Matrix<float,6,1,0,6,1>::operator=
              ((Matrix<float,6,1,0,6,1> *)&v12,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)(u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 4));
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v12,0);
    fVar10 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v12,1);
    fVar11 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v12,2);
    fVar12 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v12,3);
    fVar13 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v12,4);
    fVar14 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v12,5);
    fVar15 = *pSVar34;
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)&u22);
    PVar784 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                         (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array + 0x22),
                         (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                         (L31.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + 4));
    v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
         PVar784.m_lhs;
    Eigen::Matrix<float,6,1,0,6,1>::operator=
              ((Matrix<float,6,1,0,6,1> *)&u22,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)(v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 4));
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u22,0);
    fVar16 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u22,1);
    fVar17 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u22,2);
    fVar18 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u22,3);
    fVar19 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u22,4);
    fVar20 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u22,5);
    fVar21 = *pSVar34;
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)&v22);
    PVar784 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fa8,
                         (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                         (L32.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + 4));
    u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
         PVar784.m_lhs;
    Eigen::Matrix<float,6,1,0,6,1>::operator=
              ((Matrix<float,6,1,0,6,1> *)&v22,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)(u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 4));
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v22,0);
    fVar22 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v22,1);
    fVar23 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v22,2);
    fVar24 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v22,3);
    fVar25 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v22,4);
    fVar26 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v22,5);
    fVar27 = *pSVar34;
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)&u32);
    PVar784 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                         (TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array + 0x22),
                         (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_864);
    v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
         PVar784.m_lhs;
    Eigen::Matrix<float,6,1,0,6,1>::operator=
              ((Matrix<float,6,1,0,6,1> *)&u32,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)(v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 4));
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u32,0);
    fVar136 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u32,1);
    fVar314 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u32,2);
    fVar137 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u32,3);
    fVar121 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u32,4);
    fVar129 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&u32,5);
    fVar135 = *pSVar34;
    Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)&v32);
    _c2 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                    ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fa8,
                     (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_b38);
    Eigen::Matrix<float,6,1,0,6,1>::operator=
              ((Matrix<float,6,1,0,6,1> *)&v32,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)&c2);
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v32,0);
    v33 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v32,1);
    v34 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v32,2);
    v35 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v32,3);
    v36 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v32,4);
    local_1644 = *pSVar34;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)&v32,5);
    local_1648 = *pSVar34;
    fVar315 = fVar4 * fVar16 * fVar314;
    fVar316 = fVar315 * fVar13 * fVar24 * v35;
    fVar412 = fVar315 * fVar12 * fVar25 * v35;
    fVar315 = fVar4 * fVar16 * fVar137;
    fVar317 = fVar315 * fVar12 * fVar25 * v34;
    fVar315 = fVar315 * fVar13 * fVar24 * v34;
    fVar38 = fVar4 * fVar17;
    fVar515 = fVar38 * fVar136 * fVar12 * fVar24 * v36;
    fVar413 = fVar38 * fVar136 * fVar13 * fVar24 * v35;
    fVar318 = fVar38 * fVar137 * fVar13 * fVar24 * v33;
    fVar39 = fVar38 * fVar121 * fVar12 * fVar24 * v33;
    fVar557 = fVar4 * fVar18;
    fVar369 = fVar557 * fVar136 * fVar12 * fVar23 * v36;
    fVar40 = fVar557 * fVar136 * fVar13 * fVar23 * v35;
    fVar319 = fVar557 * fVar314 * fVar13 * fVar22 * v35;
    fVar558 = fVar557 * fVar137 * fVar13;
    fVar138 = fVar558 * fVar22 * v34;
    fVar559 = fVar558 * fVar23 * v33;
    fVar139 = fVar557 * fVar121 * fVar12 * fVar23 * v33;
    fVar140 = fVar4 * fVar19 * fVar314 * fVar12 * fVar22 * v35;
    fVar320 = fVar4 * fVar19 * fVar137 * fVar12 * fVar22 * v34;
    fVar560 = fVar5 * fVar16;
    fVar141 = fVar560 * fVar136 * fVar12;
    fVar558 = fVar141 * fVar24 * v36;
    fVar142 = fVar141 * fVar25 * v35;
    fVar561 = fVar560 * fVar137 * fVar12;
    fVar562 = fVar561 * fVar25 * v33;
    fVar143 = fVar560 * fVar121 * fVar12 * fVar24 * v33;
    fVar563 = fVar5 * fVar18;
    fVar141 = fVar563 * fVar136 * fVar12;
    fVar41 = fVar141 * fVar22 * v36;
    fVar144 = fVar563 * fVar121 * fVar12 * fVar22 * v33;
    fVar321 = fVar5 * fVar19 * fVar136 * fVar12 * fVar22 * v35;
    fVar42 = fVar5 * fVar19 * fVar137 * fVar12 * fVar22 * v33;
    fVar487 = fVar6 * fVar16;
    fVar43 = fVar487 * fVar136 * fVar11;
    fVar690 = fVar43 * fVar24 * v36;
    fVar43 = fVar43 * fVar25 * v35;
    fVar44 = fVar487 * fVar314;
    fVar45 = fVar44 * fVar10 * fVar25 * v35;
    fVar691 = fVar487 * fVar137;
    fVar322 = fVar691 * fVar10 * fVar25 * v34;
    fVar46 = fVar691 * fVar11 * fVar25 * v33;
    fVar488 = fVar487 * fVar121 * fVar11 * fVar24 * v33;
    fVar604 = fVar6 * fVar17;
    fVar323 = fVar604 * fVar136;
    fVar324 = fVar323 * fVar10 * fVar24 * v36;
    fVar325 = fVar604 * fVar121 * fVar10 * fVar24 * v33;
    fVar326 = fVar6 * fVar18;
    fVar516 = fVar326 * fVar136;
    fVar447 = fVar516 * fVar10 * fVar23 * v36;
    fVar145 = fVar516 * fVar11 * fVar22 * v36;
    fVar641 = fVar326 * fVar121 * fVar10 * fVar23 * v33;
    fVar489 = fVar326 * fVar121 * fVar11 * fVar22 * v33;
    fVar146 = fVar6 * fVar19;
    fVar47 = fVar146 * fVar136 * fVar11 * fVar22 * v35;
    fVar48 = fVar146 * fVar314 * fVar10 * fVar22 * v35;
    fVar642 = fVar146 * fVar137 * fVar10 * fVar22 * v34;
    fVar147 = fVar146 * fVar137 * fVar11 * fVar22 * v33;
    fVar148 = fVar7 * fVar16 * fVar314 * fVar10 * fVar24 * v35;
    fVar146 = fVar7 * fVar16 * fVar137 * fVar10 * fVar24 * v34;
    fVar49 = fVar7 * fVar17 * fVar136 * fVar10 * fVar24 * v35;
    fVar149 = fVar7 * fVar17 * fVar137 * fVar10 * fVar24 * v33;
    fVar490 = fVar7 * fVar18;
    fVar50 = fVar490 * fVar136 * fVar10 * fVar23 * v35;
    fVar150 = fVar490 * fVar314 * fVar10 * fVar22 * v35;
    fVar490 = fVar490 * fVar137 * fVar10;
    fVar151 = fVar490 * fVar22 * v34;
    fVar491 = fVar490 * fVar23 * v33;
    fVar643 = fVar38 * fVar314 * fVar12;
    fVar490 = fVar643 * fVar24 * local_1644;
    fVar644 = fVar643 * fVar26 * v35;
    fVar624 = fVar38 * fVar137 * fVar12;
    fVar625 = fVar624 * fVar26 * v34;
    fVar492 = fVar38 * fVar129 * fVar12 * fVar24 * v34;
    fVar152 = fVar557 * fVar314 * fVar12;
    fVar153 = fVar152 * fVar23 * local_1644;
    fVar154 = fVar557 * fVar129 * fVar12 * fVar23 * v34;
    fVar155 = fVar4 * fVar20 * fVar314 * fVar12 * fVar23 * v35;
    fVar493 = fVar4 * fVar20 * fVar137 * fVar12 * fVar23 * v34;
    fVar156 = fVar560 * fVar314 * fVar12 * fVar24 * local_1644;
    fVar626 = fVar560 * fVar314 * fVar14 * fVar24 * v35;
    fVar643 = fVar560 * fVar137 * fVar14 * fVar24 * v34;
    fVar627 = fVar560 * fVar129 * fVar12 * fVar24 * v34;
    fVar157 = fVar5 * fVar17 * fVar136;
    fVar645 = fVar157 * fVar12 * fVar26 * v35;
    fVar158 = fVar157 * fVar14 * fVar24 * v35;
    fVar157 = fVar5 * fVar17 * fVar137;
    fVar628 = fVar157 * fVar12 * fVar26 * v33;
    fVar157 = fVar157 * fVar14 * fVar24 * v33;
    fVar564 = fVar563 * fVar136 * fVar14 * fVar23 * v35;
    fVar159 = fVar563 * fVar314 * fVar12 * fVar22 * local_1644;
    fVar51 = fVar563 * fVar314 * fVar14 * fVar22 * v35;
    fVar52 = fVar563 * fVar137 * fVar14;
    fVar494 = fVar52 * fVar22 * v34;
    fVar52 = fVar52 * fVar23 * v33;
    fVar160 = fVar563 * fVar129 * fVar12 * fVar22 * v34;
    fVar495 = fVar5 * fVar20 * fVar136 * fVar12 * fVar23 * v35;
    fVar53 = fVar5 * fVar20 * fVar137 * fVar12 * fVar23 * v33;
    fVar54 = fVar44 * fVar11 * fVar24 * local_1644;
    fVar646 = fVar487 * fVar129 * fVar11 * fVar24 * v34;
    fVar55 = fVar323 * fVar11 * fVar26 * v35;
    fVar56 = fVar604 * fVar314 * fVar10;
    fVar161 = fVar56 * fVar24 * local_1644;
    fVar56 = fVar56 * fVar26 * v35;
    fVar647 = fVar604 * fVar137;
    fVar565 = fVar647 * fVar10 * fVar26 * v34;
    fVar57 = fVar647 * fVar11 * fVar26 * v33;
    fVar58 = fVar604 * fVar129 * fVar10 * fVar24 * v34;
    fVar566 = fVar326 * fVar314;
    fVar59 = fVar566 * fVar10 * fVar23 * local_1644;
    fVar162 = fVar566 * fVar11 * fVar22 * local_1644;
    fVar163 = fVar326 * fVar129 * fVar10 * fVar23 * v34;
    fVar164 = fVar326 * fVar129 * fVar11 * fVar22 * v34;
    fVar165 = fVar6 * fVar20;
    fVar166 = fVar165 * fVar136 * fVar11 * fVar23 * v35;
    fVar60 = fVar165 * fVar314 * fVar10 * fVar23 * v35;
    fVar167 = fVar165 * fVar137 * fVar10 * fVar23 * v34;
    fVar165 = fVar165 * fVar137 * fVar11 * fVar23 * v33;
    fVar168 = fVar8 * fVar16 * fVar314 * fVar11 * fVar24 * v35;
    fVar169 = fVar8 * fVar16 * fVar137 * fVar11 * fVar24 * v34;
    fVar61 = fVar8 * fVar17 * fVar136 * fVar11 * fVar24 * v35;
    fVar170 = fVar8 * fVar17 * fVar137 * fVar11 * fVar24 * v33;
    fVar62 = fVar8 * fVar18;
    fVar63 = fVar62 * fVar136 * fVar11 * fVar23 * v35;
    fVar64 = fVar62 * fVar314 * fVar11 * fVar22 * v35;
    fVar62 = fVar62 * fVar137 * fVar11;
    fVar65 = fVar62 * fVar22 * v34;
    fVar62 = fVar62 * fVar23 * v33;
    fVar171 = fVar624 * fVar24 * local_1648;
    fVar38 = fVar38 * fVar135 * fVar12 * fVar24 * v35;
    fVar172 = fVar152 * fVar27 * v35;
    fVar152 = fVar557 * fVar137 * fVar12;
    fVar173 = fVar152 * fVar23 * local_1648;
    fVar152 = fVar152 * fVar27 * v34;
    fVar557 = fVar557 * fVar135 * fVar12 * fVar23 * v35;
    fVar174 = fVar4 * fVar21 * fVar314 * fVar12 * fVar24 * v35;
    fVar175 = fVar4 * fVar21 * fVar137 * fVar12 * fVar24 * v34;
    fVar176 = fVar561 * fVar24 * local_1648;
    fVar177 = fVar560 * fVar135 * fVar12 * fVar24 * v35;
    fVar178 = fVar141 * fVar27 * v35;
    fVar141 = fVar563 * fVar137 * fVar12;
    fVar560 = fVar141 * fVar22 * local_1648;
    fVar141 = fVar141 * fVar27 * v33;
    fVar179 = fVar563 * fVar135 * fVar12 * fVar22 * v35;
    fVar180 = fVar5 * fVar21 * fVar136 * fVar12 * fVar24 * v35;
    fVar370 = fVar5 * fVar21 * fVar137 * fVar12 * fVar24 * v33;
    fVar44 = fVar44 * fVar15 * fVar24 * v35;
    fVar181 = fVar691 * fVar11 * fVar24 * local_1648;
    fVar692 = fVar691 * fVar15 * fVar24 * v34;
    fVar182 = fVar487 * fVar135 * fVar11 * fVar24 * v35;
    fVar323 = fVar323 * fVar15 * fVar24 * v35;
    fVar629 = fVar647 * fVar10 * fVar24 * local_1648;
    fVar648 = fVar647 * fVar15 * fVar24 * v33;
    fVar605 = fVar604 * fVar135 * fVar10 * fVar24 * v35;
    fVar448 = fVar516 * fVar11 * fVar27 * v35;
    fVar517 = fVar516 * fVar15 * fVar23 * v35;
    fVar496 = fVar566 * fVar10 * fVar27 * v35;
    fVar567 = fVar566 * fVar15 * fVar22 * v35;
    fVar487 = fVar326 * fVar137;
    fVar518 = fVar487 * fVar10 * fVar23 * local_1648;
    fVar497 = fVar487 * fVar10 * fVar27 * v34;
    fVar568 = fVar487 * fVar11 * fVar22 * local_1648;
    fVar498 = fVar487 * fVar11 * fVar27 * v33;
    fVar371 = fVar487 * fVar15 * fVar22 * v34;
    fVar449 = fVar487 * fVar15 * fVar23 * v33;
    fVar487 = fVar326 * fVar135 * fVar10 * fVar23 * v35;
    fVar327 = fVar326 * fVar135 * fVar11 * fVar22 * v35;
    fVar561 = fVar6 * fVar21;
    fVar183 = fVar561 * fVar136 * fVar11 * fVar24 * v35;
    fVar326 = fVar561 * fVar314 * fVar10 * fVar24 * v35;
    fVar516 = fVar561 * fVar137 * fVar10 * fVar24 * v34;
    fVar761 = fVar561 * fVar137 * fVar11 * fVar24 * v33;
    fVar681 = fVar9 * fVar16 * fVar314 * fVar12 * fVar24 * v35;
    fVar569 = fVar9 * fVar16 * fVar137 * fVar12 * fVar24 * v34;
    fVar736 = fVar9 * fVar17 * fVar136 * fVar12 * fVar24 * v35;
    fVar682 = fVar9 * fVar17 * fVar137 * fVar12 * fVar24 * v33;
    fVar561 = fVar9 * fVar18;
    fVar414 = fVar561 * fVar136 * fVar12 * fVar23 * v35;
    fVar415 = fVar561 * fVar314 * fVar12 * fVar22 * v35;
    fVar563 = fVar561 * fVar137 * fVar12;
    fVar561 = fVar563 * fVar22 * v34;
    fVar184 = fVar563 * fVar23 * v33;
    fVar519 = fVar4 + fVar4;
    fVar647 = fVar519 * fVar16 * fVar137;
    fVar563 = fVar647 * fVar13 * fVar24 * v33;
    fVar372 = fVar647 * fVar12 * fVar25 * v33;
    fVar683 = fVar519 * fVar18;
    fVar737 = fVar683 * fVar136;
    fVar416 = fVar737 * fVar12 * fVar22 * v36;
    fVar417 = fVar737 * fVar13 * fVar22 * v35;
    fVar373 = fVar683 * fVar121 * fVar12;
    fVar374 = fVar373 * fVar22 * v33;
    fVar450 = fVar519 * fVar19 * fVar137 * fVar12;
    fVar328 = fVar450 * fVar22 * v33;
    fVar499 = fVar6 + fVar6;
    fVar762 = fVar499 * fVar16;
    fVar566 = fVar762 * fVar136 * fVar10;
    fVar418 = fVar566 * fVar24 * v36;
    fVar566 = fVar566 * fVar25 * v35;
    fVar763 = fVar762 * fVar121 * fVar10 * fVar24 * v33;
    fVar570 = fVar499 * fVar19;
    fVar419 = fVar570 * fVar136 * fVar10 * fVar22 * v35;
    fVar420 = fVar7 + fVar7;
    fVar421 = fVar420 * fVar16 * fVar137;
    fVar604 = fVar421 * fVar10 * fVar24 * v33;
    fVar329 = fVar420 * fVar18;
    fVar693 = fVar329 * fVar136 * fVar10 * fVar22 * v35;
    fVar624 = fVar519 * fVar16 * fVar314;
    fVar764 = fVar624 * fVar12 * fVar26 * v35;
    fVar630 = fVar624 * fVar14 * fVar24 * v35;
    fVar624 = fVar647 * fVar12 * fVar26 * v34;
    fVar185 = fVar647 * fVar14 * fVar24 * v34;
    fVar694 = fVar519 * fVar17;
    fVar765 = fVar694 * fVar136 * fVar12 * fVar24 * local_1644;
    fVar647 = fVar694 * fVar136 * fVar14 * fVar24 * v35;
    fVar691 = fVar694 * fVar314 * fVar12;
    fVar186 = fVar691 * fVar24 * v36;
    fVar766 = fVar691 * fVar25 * v35;
    fVar767 = fVar694 * fVar137;
    fVar691 = fVar767 * fVar12 * fVar25 * v34;
    fVar768 = fVar767 * fVar12 * fVar26 * v33;
    fVar187 = fVar767 * fVar13 * fVar24 * v34;
    fVar767 = fVar767 * fVar14 * fVar24 * v33;
    fVar66 = fVar694 * fVar121 * fVar12 * fVar24 * v34;
    fVar695 = fVar694 * fVar129 * fVar12 * fVar24 * v33;
    fVar606 = fVar737 * fVar12 * fVar23 * local_1644;
    fVar738 = fVar737 * fVar14 * fVar23 * v35;
    fVar694 = fVar683 * fVar314;
    fVar769 = fVar694 * fVar12 * fVar22 * local_1644;
    fVar696 = fVar694 * fVar12 * fVar23 * v36;
    fVar697 = fVar694 * fVar13 * fVar23 * v35;
    fVar739 = fVar694 * fVar14 * fVar22 * v35;
    fVar694 = fVar683 * fVar137 * fVar14;
    fVar607 = fVar694 * fVar22 * v34;
    fVar698 = fVar694 * fVar23 * v33;
    fVar373 = fVar373 * fVar23 * v34;
    fVar694 = fVar683 * fVar129 * fVar12;
    fVar699 = fVar694 * fVar22 * v34;
    fVar608 = fVar694 * fVar23 * v33;
    fVar520 = fVar519 * fVar19 * fVar314 * fVar12 * fVar23 * v35;
    fVar451 = fVar450 * fVar23 * v34;
    fVar452 = fVar519 * fVar20 * fVar314 * fVar12 * fVar22 * v35;
    fVar694 = fVar519 * fVar20 * fVar137 * fVar12;
    fVar450 = fVar694 * fVar22 * v34;
    fVar521 = fVar694 * fVar23 * v33;
    fVar609 = fVar5 + fVar5;
    fVar694 = fVar609 * fVar16;
    fVar737 = fVar694 * fVar136 * fVar12;
    fVar700 = fVar737 * fVar24 * local_1644;
    fVar453 = fVar737 * fVar26 * v35;
    fVar740 = fVar694 * fVar314 * fVar12 * fVar24 * v36;
    fVar522 = fVar694 * fVar314 * fVar13 * fVar24 * v35;
    fVar737 = fVar694 * fVar137;
    fVar701 = fVar737 * fVar12 * fVar25 * v34;
    fVar454 = fVar737 * fVar12 * fVar26 * v33;
    fVar702 = fVar737 * fVar13 * fVar24 * v34;
    fVar523 = fVar737 * fVar14 * fVar24 * v33;
    fVar524 = fVar694 * fVar121 * fVar12 * fVar24 * v34;
    fVar694 = fVar694 * fVar129 * fVar12 * fVar24 * v33;
    fVar737 = fVar609 * fVar17 * fVar136;
    fVar525 = fVar737 * fVar12 * fVar25 * v35;
    fVar455 = fVar737 * fVar13 * fVar24 * v35;
    fVar703 = fVar609 * fVar17 * fVar137;
    fVar737 = fVar703 * fVar12 * fVar25 * v33;
    fVar704 = fVar703 * fVar13 * fVar24 * v33;
    fVar456 = fVar609 * fVar18;
    fVar67 = fVar456 * fVar136;
    fVar741 = fVar67 * fVar12 * fVar22 * local_1644;
    fVar526 = fVar67 * fVar12 * fVar23 * v36;
    fVar527 = fVar67 * fVar13 * fVar23 * v35;
    fVar67 = fVar67 * fVar14 * fVar22 * v35;
    fVar528 = fVar456 * fVar314;
    fVar529 = fVar528 * fVar12 * fVar22 * v36;
    fVar68 = fVar528 * fVar13 * fVar22 * v35;
    fVar69 = fVar456 * fVar137 * fVar13;
    fVar705 = fVar69 * fVar22 * v34;
    fVar69 = fVar69 * fVar23 * v33;
    fVar530 = fVar456 * fVar121 * fVar12;
    fVar706 = fVar530 * fVar22 * v34;
    fVar531 = fVar530 * fVar23 * v33;
    fVar532 = fVar456 * fVar129 * fVar12;
    fVar533 = fVar532 * fVar22 * v33;
    fVar375 = fVar609 * fVar19 * fVar136 * fVar12 * fVar23 * v35;
    fVar530 = fVar609 * fVar19 * fVar137 * fVar12;
    fVar742 = fVar530 * fVar22 * v34;
    fVar530 = fVar530 * fVar23 * v33;
    fVar376 = fVar609 * fVar20 * fVar136 * fVar12 * fVar22 * v35;
    fVar743 = fVar609 * fVar20 * fVar137 * fVar12;
    fVar377 = fVar743 * fVar22 * v33;
    fVar649 = fVar762 * fVar136 * fVar11;
    fVar378 = fVar649 * fVar24 * local_1644;
    fVar650 = fVar649 * fVar26 * v35;
    fVar649 = fVar762 * fVar314 * fVar10;
    fVar534 = fVar649 * fVar24 * local_1644;
    fVar379 = fVar649 * fVar26 * v35;
    fVar649 = fVar762 * fVar314 * fVar11;
    fVar380 = fVar649 * fVar24 * v36;
    fVar649 = fVar649 * fVar25 * v35;
    fVar70 = fVar762 * fVar137;
    fVar71 = fVar70 * fVar10 * fVar26 * v34;
    fVar72 = fVar70 * fVar11 * fVar26 * v33;
    fVar188 = fVar762 * fVar121 * fVar11 * fVar24 * v34;
    fVar381 = fVar762 * fVar129 * fVar10 * fVar24 * v34;
    fVar651 = fVar762 * fVar129 * fVar11 * fVar24 * v33;
    fVar382 = fVar499 * fVar17;
    fVar189 = fVar382 * fVar136 * fVar10;
    fVar73 = fVar189 * fVar24 * local_1644;
    fVar190 = fVar189 * fVar26 * v35;
    fVar189 = fVar382 * fVar136 * fVar11;
    fVar770 = fVar189 * fVar24 * v36;
    fVar535 = fVar189 * fVar25 * v35;
    fVar536 = fVar382 * fVar314 * fVar10;
    fVar189 = fVar536 * fVar24 * v36;
    fVar537 = fVar536 * fVar25 * v35;
    fVar771 = fVar382 * fVar137;
    fVar191 = fVar771 * fVar10 * fVar25 * v34;
    fVar536 = fVar771 * fVar11 * fVar25 * v33;
    fVar707 = fVar382 * fVar121 * fVar10 * fVar24 * v34;
    fVar74 = fVar382 * fVar121 * fVar11 * fVar24 * v33;
    fVar708 = fVar382 * fVar129 * fVar10 * fVar24 * v33;
    fVar709 = fVar499 * fVar18;
    fVar652 = fVar709 * fVar136;
    fVar653 = fVar652 * fVar10 * fVar23 * local_1644;
    fVar75 = fVar652 * fVar11 * fVar22 * local_1644;
    fVar710 = fVar709 * fVar314;
    fVar76 = fVar710 * fVar10 * fVar23 * v36;
    fVar77 = fVar710 * fVar11 * fVar22 * v36;
    fVar78 = fVar709 * fVar121 * fVar10 * fVar23 * v34;
    fVar192 = fVar709 * fVar121 * fVar11 * fVar22 * v34;
    fVar79 = fVar709 * fVar129 * fVar10 * fVar23 * v33;
    fVar709 = fVar709 * fVar129 * fVar11 * fVar22 * v33;
    fVar193 = fVar570 * fVar136 * fVar11 * fVar23 * v35;
    fVar194 = fVar570 * fVar314 * fVar10 * fVar23 * v35;
    fVar195 = fVar570 * fVar314 * fVar11 * fVar22 * v35;
    fVar80 = fVar570 * fVar137 * fVar10 * fVar23 * v34;
    fVar571 = fVar570 * fVar137 * fVar11 * fVar23 * v33;
    fVar196 = fVar499 * fVar20;
    fVar197 = fVar196 * fVar136 * fVar10 * fVar23 * v35;
    fVar570 = fVar196 * fVar136 * fVar11 * fVar22 * v35;
    fVar81 = fVar196 * fVar314 * fVar10 * fVar22 * v35;
    fVar572 = fVar196 * fVar137 * fVar10 * fVar22 * v34;
    fVar198 = fVar196 * fVar137 * fVar11 * fVar22 * v33;
    fVar82 = fVar420 * fVar16 * fVar314 * fVar11 * fVar24 * v35;
    fVar422 = fVar421 * fVar11 * fVar24 * v34;
    fVar421 = fVar420 * fVar17 * fVar136 * fVar11 * fVar24 * v35;
    fVar420 = fVar420 * fVar17 * fVar137;
    fVar573 = fVar420 * fVar10 * fVar24 * v34;
    fVar199 = fVar420 * fVar11 * fVar24 * v33;
    fVar330 = fVar329 * fVar136 * fVar11 * fVar23 * v35;
    fVar200 = fVar329 * fVar314 * fVar10 * fVar23 * v35;
    fVar331 = fVar329 * fVar314 * fVar11 * fVar22 * v35;
    fVar420 = fVar329 * fVar137 * fVar11;
    fVar201 = fVar420 * fVar22 * v34;
    fVar420 = fVar420 * fVar23 * v33;
    fVar332 = fVar8 + fVar8;
    fVar423 = fVar332 * fVar16 * fVar314 * fVar10 * fVar24 * v35;
    fVar329 = fVar332 * fVar16 * fVar137;
    fVar424 = fVar329 * fVar10 * fVar24 * v34;
    fVar329 = fVar329 * fVar11 * fVar24 * v33;
    fVar83 = fVar332 * fVar17 * fVar136 * fVar10 * fVar24 * v35;
    fVar574 = fVar332 * fVar17 * fVar137;
    fVar575 = fVar574 * fVar10 * fVar24 * v33;
    fVar332 = fVar332 * fVar18;
    fVar425 = fVar332 * fVar136 * fVar10 * fVar23 * v35;
    fVar202 = fVar332 * fVar136 * fVar11 * fVar22 * v35;
    fVar426 = fVar332 * fVar314 * fVar10 * fVar22 * v35;
    fVar333 = fVar332 * fVar137 * fVar10;
    fVar427 = fVar333 * fVar22 * v34;
    fVar334 = fVar333 * fVar23 * v33;
    fVar333 = fVar683 * fVar137 * fVar12;
    fVar428 = fVar333 * fVar22 * local_1648;
    fVar333 = fVar333 * fVar27 * v33;
    fVar684 = fVar683 * fVar135 * fVar12 * fVar22 * v35;
    fVar203 = fVar519 * fVar21 * fVar137 * fVar12 * fVar24 * v33;
    fVar204 = fVar703 * fVar12 * fVar26 * v34;
    fVar519 = fVar703 * fVar14 * fVar24 * v34;
    fVar683 = fVar528 * fVar12 * fVar23 * local_1644;
    fVar528 = fVar528 * fVar14 * fVar23 * v35;
    fVar205 = fVar532 * fVar23 * v34;
    fVar744 = fVar743 * fVar23 * v34;
    fVar206 = fVar70 * fVar10 * fVar24 * local_1648;
    fVar70 = fVar70 * fVar15 * fVar24 * v33;
    fVar207 = fVar762 * fVar135 * fVar10 * fVar24 * v35;
    fVar532 = fVar382 * fVar314 * fVar11;
    fVar208 = fVar532 * fVar24 * local_1644;
    fVar532 = fVar532 * fVar26 * v35;
    fVar703 = fVar382 * fVar129 * fVar11 * fVar24 * v34;
    fVar209 = fVar652 * fVar10 * fVar27 * v35;
    fVar652 = fVar652 * fVar15 * fVar22 * v35;
    fVar196 = fVar196 * fVar314 * fVar11 * fVar23 * v35;
    fVar210 = fVar499 * fVar21 * fVar136 * fVar10 * fVar24 * v35;
    fVar574 = fVar574 * fVar11 * fVar24 * v34;
    fVar332 = fVar332 * fVar314 * fVar11 * fVar23 * v35;
    fVar743 = fVar9 + fVar9;
    fVar762 = fVar743 * fVar16 * fVar137 * fVar12 * fVar24 * v33;
    fVar84 = fVar743 * fVar18 * fVar136 * fVar12 * fVar22 * v35;
    fVar85 = fVar456 * fVar137 * fVar12;
    fVar86 = fVar85 * fVar23 * local_1648;
    fVar211 = fVar85 * fVar27 * v34;
    fVar457 = fVar456 * fVar135 * fVar12 * fVar23 * v35;
    fVar610 = fVar609 * fVar21 * fVar137 * fVar12 * fVar24 * v34;
    fVar538 = fVar771 * fVar11 * fVar24 * local_1648;
    fVar772 = fVar771 * fVar15 * fVar24 * v34;
    fVar383 = fVar382 * fVar135 * fVar11 * fVar24 * v35;
    fVar654 = fVar710 * fVar11 * fVar27 * v35;
    fVar711 = fVar710 * fVar15 * fVar23 * v35;
    fVar500 = fVar499 * fVar21 * fVar314 * fVar11 * fVar24 * v35;
    fVar85 = fVar743 * fVar17 * fVar137 * fVar12 * fVar24 * v34;
    fVar212 = fVar743 * fVar18 * fVar314 * fVar12 * fVar23 * v35;
    fVar685 = fVar4 + fVar4;
    fVar743 = fVar685 * fVar16 * fVar137;
    fVar499 = fVar4 * 4.0;
    fVar382 = fVar499 * fVar16 * fVar137;
    fVar501 = fVar382 * fVar12 * fVar26 * v33;
    fVar384 = fVar743 * fVar13 * fVar24 * v34;
    fVar429 = fVar743 * fVar12 * fVar25 * v34;
    fVar458 = fVar382 * fVar14 * fVar24 * v33;
    fVar430 = fVar499 * fVar17 * fVar137;
    fVar431 = fVar430 * fVar12 * fVar25 * v33;
    fVar539 = fVar685 * fVar17 * fVar137;
    fVar743 = fVar539 * fVar13 * fVar24 * v33;
    fVar382 = fVar499 * fVar18;
    fVar502 = fVar382 * fVar136 * fVar12 * fVar22 * local_1644;
    fVar432 = fVar685 * fVar18;
    fVar385 = fVar432 * fVar136 * fVar12 * fVar23 * v36;
    fVar433 = fVar432 * fVar136 * fVar13 * fVar23 * v35;
    fVar335 = fVar382 * fVar136 * fVar14 * fVar22 * v35;
    fVar336 = fVar382 * fVar314 * fVar12 * fVar22 * v36;
    fVar337 = fVar432 * fVar314 * fVar13 * fVar22 * v35;
    fVar503 = fVar382 * fVar121 * fVar12 * fVar22 * v34;
    fVar434 = fVar432 * fVar121 * fVar12 * fVar23 * v33;
    fVar456 = fVar382 * fVar129 * fVar12 * fVar22 * v33;
    fVar504 = fVar685 * fVar19 * fVar137 * fVar12 * fVar22 * v34;
    fVar505 = fVar499 * fVar19 * fVar137 * fVar12 * fVar23 * v33;
    fVar213 = fVar499 * fVar20 * fVar137 * fVar12 * fVar22 * v33;
    fVar435 = fVar5 + fVar5;
    fVar655 = fVar435 * fVar16 * fVar137;
    fVar656 = fVar655 * fVar12;
    fVar499 = fVar656 * fVar25 * v33;
    fVar576 = fVar5 * 4.0;
    fVar386 = fVar576 * fVar16 * fVar137;
    fVar387 = fVar386 * fVar13 * fVar24 * v33;
    fVar388 = fVar435 * fVar18;
    fVar389 = fVar388 * fVar136 * fVar12;
    fVar214 = fVar389 * fVar22 * v36;
    fVar577 = fVar576 * fVar18;
    fVar578 = fVar577 * fVar136 * fVar13 * fVar22 * v35;
    fVar215 = fVar388 * fVar121 * fVar12 * fVar22 * v33;
    fVar216 = fVar435 * fVar19 * fVar137 * fVar12 * fVar22 * v33;
    fVar631 = fVar6 * 4.0;
    fVar609 = fVar631 * fVar16;
    fVar710 = fVar609 * fVar136 * fVar10;
    fVar579 = fVar710 * fVar24 * local_1644;
    fVar338 = fVar710 * fVar26 * v35;
    fVar611 = fVar6 + fVar6;
    fVar217 = fVar611 * fVar16;
    fVar710 = fVar217 * fVar136 * fVar11;
    fVar580 = fVar710 * fVar24 * v36;
    fVar218 = fVar710 * fVar25 * v35;
    fVar339 = fVar609 * fVar314 * fVar10 * fVar24 * v36;
    fVar581 = fVar217 * fVar314;
    fVar219 = fVar581 * fVar10 * fVar25 * v35;
    fVar220 = fVar609 * fVar121 * fVar10 * fVar24 * v34;
    fVar221 = fVar217 * fVar121 * fVar11 * fVar24 * v33;
    fVar710 = fVar609 * fVar129 * fVar10 * fVar24 * v33;
    fVar340 = fVar611 * fVar17;
    fVar341 = fVar340 * fVar136;
    fVar712 = fVar341 * fVar10 * fVar24 * v36;
    fVar771 = fVar631 * fVar17;
    fVar87 = fVar771 * fVar136 * fVar10 * fVar25 * v35;
    fVar222 = fVar340 * fVar121 * fVar10 * fVar24 * v33;
    fVar713 = fVar631 * fVar19 * fVar136 * fVar10 * fVar23 * v35;
    fVar88 = fVar611 * fVar19 * fVar136 * fVar11 * fVar22 * v35;
    fVar223 = fVar611 * fVar19 * fVar314 * fVar10 * fVar22 * v35;
    fVar632 = fVar631 * fVar20 * fVar136 * fVar10 * fVar22 * v35;
    fVar633 = fVar7 + fVar7;
    fVar714 = fVar633 * fVar16 * fVar137 * fVar10 * fVar24 * v34;
    fVar773 = fVar7 * 4.0;
    fVar745 = fVar773 * fVar16 * fVar137 * fVar11 * fVar24 * v33;
    fVar715 = fVar633 * fVar17 * fVar137 * fVar10 * fVar24 * v33;
    fVar716 = fVar633 * fVar18 * fVar136 * fVar10 * fVar23 * v35;
    fVar224 = fVar773 * fVar18 * fVar136 * fVar11 * fVar22 * v35;
    fVar634 = fVar633 * fVar18 * fVar314 * fVar10 * fVar22 * v35;
    fVar746 = fVar8 * 4.0;
    fVar633 = fVar746 * fVar16 * fVar137 * fVar10 * fVar24 * v33;
    fVar89 = fVar746 * fVar18 * fVar136 * fVar10 * fVar22 * v35;
    fVar539 = fVar539 * fVar12;
    fVar90 = fVar539 * fVar26 * v34;
    fVar430 = fVar430 * fVar14 * fVar24 * v34;
    fVar225 = fVar432 * fVar314 * fVar12;
    fVar226 = fVar225 * fVar23 * local_1644;
    fVar382 = fVar382 * fVar314 * fVar14 * fVar23 * v35;
    fVar432 = fVar432 * fVar129 * fVar12 * fVar23 * v34;
    fVar91 = fVar685 * fVar20 * fVar137 * fVar12 * fVar23 * v34;
    fVar386 = fVar386 * fVar12 * fVar26 * v34;
    fVar655 = fVar655 * fVar14 * fVar24 * v34;
    fVar227 = fVar576 * fVar17 * fVar137;
    fVar228 = fVar227 * fVar12 * fVar25 * v34;
    fVar229 = fVar435 * fVar17 * fVar137;
    fVar230 = fVar229 * fVar12 * fVar26 * v33;
    fVar227 = fVar227 * fVar13 * fVar24 * v34;
    fVar229 = fVar229 * fVar14 * fVar24 * v33;
    fVar92 = fVar577 * fVar136 * fVar12 * fVar23 * local_1644;
    fVar231 = fVar388 * fVar136 * fVar14 * fVar23 * v35;
    fVar232 = fVar388 * fVar314 * fVar12 * fVar22 * local_1644;
    fVar233 = fVar577 * fVar314 * fVar12 * fVar23 * v36;
    fVar234 = fVar577 * fVar314 * fVar13 * fVar23 * v35;
    fVar93 = fVar388 * fVar314 * fVar14 * fVar22 * v35;
    fVar94 = fVar577 * fVar121 * fVar12 * fVar23 * v34;
    fVar235 = fVar388 * fVar129 * fVar12 * fVar22 * v34;
    fVar236 = fVar577 * fVar129 * fVar12 * fVar23 * v33;
    fVar388 = fVar576 * fVar19 * fVar137 * fVar12 * fVar23 * v34;
    fVar576 = fVar576 * fVar20 * fVar137 * fVar12 * fVar22 * v34;
    fVar577 = fVar435 * fVar20 * fVar137 * fVar12 * fVar23 * v33;
    fVar95 = fVar581 * fVar11 * fVar24 * local_1644;
    fVar609 = fVar609 * fVar314 * fVar11 * fVar26 * v35;
    fVar237 = fVar217 * fVar129 * fVar11 * fVar24 * v34;
    fVar238 = fVar771 * fVar136 * fVar11 * fVar24 * local_1644;
    fVar217 = fVar341 * fVar11 * fVar26 * v35;
    fVar96 = fVar340 * fVar314 * fVar10;
    fVar97 = fVar96 * fVar24 * local_1644;
    fVar239 = fVar96 * fVar26 * v35;
    fVar96 = fVar771 * fVar314 * fVar11;
    fVar98 = fVar96 * fVar24 * v36;
    fVar240 = fVar96 * fVar25 * v35;
    fVar96 = fVar771 * fVar121 * fVar11 * fVar24 * v34;
    fVar340 = fVar340 * fVar129 * fVar10 * fVar24 * v34;
    fVar241 = fVar771 * fVar129 * fVar11 * fVar24 * v33;
    fVar771 = fVar631 * fVar19 * fVar314 * fVar11 * fVar23 * v35;
    fVar99 = fVar611 * fVar20 * fVar136 * fVar11 * fVar23 * v35;
    fVar242 = fVar611 * fVar20 * fVar314 * fVar10 * fVar23 * v35;
    fVar243 = fVar631 * fVar20 * fVar314 * fVar11 * fVar22 * v35;
    fVar774 = fVar773 * fVar17 * fVar137 * fVar11 * fVar24 * v34;
    fVar717 = fVar773 * fVar18 * fVar314 * fVar11 * fVar23 * v35;
    fVar631 = fVar8 + fVar8;
    fVar718 = fVar631 * fVar16 * fVar137 * fVar11 * fVar24 * v34;
    fVar747 = fVar746 * fVar17 * fVar137 * fVar10 * fVar24 * v34;
    fVar748 = fVar631 * fVar17 * fVar137 * fVar11 * fVar24 * v33;
    fVar749 = fVar631 * fVar18 * fVar136 * fVar11 * fVar23 * v35;
    fVar635 = fVar746 * fVar18 * fVar314 * fVar10 * fVar23 * v35;
    fVar244 = fVar631 * fVar18 * fVar314 * fVar11 * fVar22 * v35;
    fVar540 = fVar539 * fVar24 * local_1648;
    fVar459 = fVar685 * fVar17 * fVar135 * fVar12 * fVar24 * v35;
    fVar225 = fVar225 * fVar27 * v35;
    fVar686 = fVar685 * fVar21 * fVar314 * fVar12 * fVar24 * v35;
    fVar657 = fVar656 * fVar24 * local_1648;
    fVar506 = fVar435 * fVar16 * fVar135 * fVar12 * fVar24 * v35;
    fVar390 = fVar389 * fVar27 * v35;
    fVar436 = fVar435 * fVar21 * fVar136 * fVar12 * fVar24 * v35;
    fVar582 = fVar581 * fVar15 * fVar24 * v35;
    fVar342 = fVar341 * fVar15 * fVar24 * v35;
    fVar631 = fVar611 * fVar18 * fVar137;
    fVar507 = fVar631 * fVar10 * fVar23 * local_1648;
    fVar460 = fVar631 * fVar10 * fVar27 * v34;
    fVar583 = fVar631 * fVar11 * fVar22 * local_1648;
    fVar461 = fVar631 * fVar11 * fVar27 * v33;
    fVar391 = fVar631 * fVar15 * fVar22 * v34;
    fVar437 = fVar631 * fVar15 * fVar23 * v33;
    fVar631 = fVar611 * fVar18 * fVar135;
    fVar245 = fVar631 * fVar10 * fVar23 * v35;
    fVar343 = fVar631 * fVar11 * fVar22 * v35;
    fVar341 = fVar611 * fVar21 * fVar137;
    fVar631 = fVar341 * fVar10 * fVar24 * v34;
    fVar612 = fVar341 * fVar11 * fVar24 * v33;
    fVar341 = fVar9 + fVar9;
    fVar438 = fVar341 * fVar16 * fVar314 * fVar12 * fVar24 * v35;
    fVar613 = fVar341 * fVar17 * fVar136 * fVar12 * fVar24 * v35;
    fVar389 = fVar341 * fVar18 * fVar137 * fVar12;
    fVar341 = fVar389 * fVar22 * v34;
    fVar246 = fVar389 * fVar23 * v33;
    fVar462 = fVar4 + fVar4;
    fVar435 = fVar462 * fVar16 * fVar137;
    fVar392 = fVar435 * fVar12 * fVar25 * v33;
    fVar344 = fVar435 * fVar13 * fVar24 * v33;
    fVar687 = fVar462 * fVar18;
    fVar611 = fVar687 * fVar136;
    fVar541 = fVar611 * fVar12 * fVar22 * v36;
    fVar345 = fVar611 * fVar13 * fVar22 * v35;
    fVar581 = fVar687 * fVar121 * fVar12;
    fVar584 = fVar581 * fVar22 * v33;
    fVar656 = fVar462 * fVar19 * fVar137 * fVar12;
    fVar346 = fVar656 * fVar22 * v33;
    fVar508 = fVar6 + fVar6;
    fVar347 = fVar508 * fVar16;
    fVar389 = fVar347 * fVar136 * fVar10;
    fVar636 = fVar389 * fVar24 * v36;
    fVar348 = fVar389 * fVar25 * v35;
    fVar585 = fVar347 * fVar121 * fVar10 * fVar24 * v33;
    fVar586 = fVar508 * fVar19;
    fVar587 = fVar586 * fVar136 * fVar10 * fVar22 * v35;
    fVar349 = fVar7 + fVar7;
    fVar637 = fVar349 * fVar16 * fVar137;
    fVar638 = fVar637 * fVar10 * fVar24 * v33;
    fVar588 = fVar349 * fVar18;
    fVar750 = fVar588 * fVar136 * fVar10 * fVar22 * v35;
    fVar389 = fVar462 * fVar16 * fVar314;
    fVar751 = fVar389 * fVar12 * fVar26 * v35;
    fVar247 = fVar389 * fVar14 * fVar24 * v35;
    fVar389 = fVar435 * fVar12 * fVar26 * v34;
    fVar439 = fVar435 * fVar14 * fVar24 * v34;
    fVar685 = fVar462 * fVar17;
    fVar775 = fVar685 * fVar136 * fVar12 * fVar24 * local_1644;
    fVar440 = fVar685 * fVar136 * fVar14 * fVar24 * v35;
    fVar539 = fVar685 * fVar314 * fVar12;
    fVar435 = fVar539 * fVar24 * v36;
    fVar441 = fVar539 * fVar25 * v35;
    fVar746 = fVar685 * fVar137;
    fVar248 = fVar746 * fVar12 * fVar25 * v34;
    fVar539 = fVar746 * fVar12 * fVar26 * v33;
    fVar442 = fVar746 * fVar13 * fVar24 * v34;
    fVar776 = fVar746 * fVar14 * fVar24 * v33;
    fVar443 = fVar685 * fVar121 * fVar12 * fVar24 * v34;
    fVar752 = fVar685 * fVar129 * fVar12 * fVar24 * v33;
    fVar658 = fVar611 * fVar12 * fVar23 * local_1644;
    fVar719 = fVar611 * fVar14 * fVar23 * v35;
    fVar611 = fVar687 * fVar314;
    fVar659 = fVar611 * fVar12 * fVar22 * local_1644;
    fVar753 = fVar611 * fVar12 * fVar23 * v36;
    fVar660 = fVar611 * fVar13 * fVar23 * v35;
    fVar444 = fVar611 * fVar14 * fVar22 * v35;
    fVar611 = fVar687 * fVar137 * fVar14;
    fVar720 = fVar611 * fVar22 * v34;
    fVar661 = fVar611 * fVar23 * v33;
    fVar393 = fVar581 * fVar23 * v34;
    fVar581 = fVar687 * fVar129 * fVar12;
    fVar662 = fVar581 * fVar22 * v34;
    fVar394 = fVar581 * fVar23 * v33;
    fVar463 = fVar462 * fVar19 * fVar314 * fVar12 * fVar23 * v35;
    fVar614 = fVar656 * fVar23 * v34;
    fVar395 = fVar462 * fVar20 * fVar314 * fVar12 * fVar22 * v35;
    fVar581 = fVar462 * fVar20 * fVar137 * fVar12;
    fVar615 = fVar581 * fVar22 * v34;
    fVar464 = fVar581 * fVar23 * v33;
    fVar616 = fVar5 + fVar5;
    fVar611 = fVar616 * fVar16;
    fVar581 = fVar611 * fVar136 * fVar12;
    fVar721 = fVar581 * fVar24 * local_1644;
    fVar663 = fVar581 * fVar26 * v35;
    fVar722 = fVar611 * fVar314 * fVar12 * fVar24 * v36;
    fVar396 = fVar611 * fVar314 * fVar13 * fVar24 * v35;
    fVar581 = fVar611 * fVar137;
    fVar754 = fVar581 * fVar12 * fVar25 * v34;
    fVar664 = fVar581 * fVar12 * fVar26 * v33;
    fVar665 = fVar581 * fVar13 * fVar24 * v34;
    fVar397 = fVar581 * fVar14 * fVar24 * v33;
    fVar666 = fVar611 * fVar121 * fVar12 * fVar24 * v34;
    fVar465 = fVar611 * fVar129 * fVar12 * fVar24 * v33;
    fVar581 = fVar616 * fVar17 * fVar136;
    fVar667 = fVar581 * fVar12 * fVar25 * v35;
    fVar398 = fVar581 * fVar13 * fVar24 * v35;
    fVar755 = fVar616 * fVar17 * fVar137;
    fVar756 = fVar755 * fVar12 * fVar25 * v33;
    fVar466 = fVar755 * fVar13 * fVar24 * v33;
    fVar467 = fVar616 * fVar18;
    fVar581 = fVar467 * fVar136;
    fVar723 = fVar581 * fVar12 * fVar22 * local_1644;
    fVar399 = fVar581 * fVar12 * fVar23 * v36;
    fVar724 = fVar581 * fVar13 * fVar23 * v35;
    fVar668 = fVar581 * fVar14 * fVar22 * v35;
    fVar669 = fVar467 * fVar314;
    fVar670 = fVar669 * fVar12 * fVar22 * v36;
    fVar671 = fVar669 * fVar13 * fVar22 * v35;
    fVar581 = fVar467 * fVar137 * fVar13;
    fVar725 = fVar581 * fVar22 * v34;
    fVar400 = fVar581 * fVar23 * v33;
    fVar581 = fVar467 * fVar121 * fVar12;
    fVar757 = fVar581 * fVar22 * v34;
    fVar672 = fVar581 * fVar23 * v33;
    fVar758 = fVar467 * fVar129 * fVar12;
    fVar401 = fVar758 * fVar22 * v33;
    fVar542 = fVar616 * fVar19 * fVar136 * fVar12 * fVar23 * v35;
    fVar581 = fVar616 * fVar19 * fVar137 * fVar12;
    fVar673 = fVar581 * fVar22 * v34;
    fVar402 = fVar581 * fVar23 * v33;
    fVar674 = fVar616 * fVar20 * fVar136 * fVar12 * fVar22 * v35;
    fVar403 = fVar616 * fVar20 * fVar137 * fVar12;
    fVar404 = fVar403 * fVar22 * v33;
    fVar581 = fVar347 * fVar136 * fVar11;
    fVar543 = fVar581 * fVar24 * local_1644;
    fVar581 = fVar581 * fVar26 * v35;
    fVar611 = fVar347 * fVar314 * fVar10;
    fVar675 = fVar611 * fVar24 * local_1644;
    fVar611 = fVar611 * fVar26 * v35;
    fVar656 = fVar347 * fVar314 * fVar11;
    fVar544 = fVar656 * fVar24 * v36;
    fVar405 = fVar656 * fVar25 * v35;
    fVar656 = fVar347 * fVar137;
    fVar685 = fVar656 * fVar10 * fVar26 * v34;
    fVar746 = fVar656 * fVar11 * fVar26 * v33;
    fVar249 = fVar347 * fVar121 * fVar11 * fVar24 * v34;
    fVar406 = fVar347 * fVar129 * fVar10 * fVar24 * v34;
    fVar773 = fVar347 * fVar129 * fVar11 * fVar24 * v33;
    fVar407 = fVar508 * fVar17;
    fVar777 = fVar407 * fVar136 * fVar10;
    fVar545 = fVar777 * fVar24 * local_1644;
    fVar778 = fVar777 * fVar26 * v35;
    fVar777 = fVar407 * fVar136 * fVar11;
    fVar250 = fVar777 * fVar24 * v36;
    fVar777 = fVar777 * fVar25 * v35;
    fVar779 = fVar407 * fVar314 * fVar10;
    fVar546 = fVar779 * fVar24 * v36;
    fVar780 = fVar779 * fVar25 * v35;
    fVar781 = fVar407 * fVar137;
    fVar726 = fVar781 * fVar10 * fVar25 * v34;
    fVar779 = fVar781 * fVar11 * fVar25 * v33;
    fVar251 = fVar407 * fVar121 * fVar10 * fVar24 * v34;
    fVar100 = fVar407 * fVar121 * fVar11 * fVar24 * v33;
    fVar101 = fVar407 * fVar129 * fVar10 * fVar24 * v33;
    fVar727 = fVar508 * fVar18;
    fVar676 = fVar727 * fVar136;
    fVar677 = fVar676 * fVar10 * fVar23 * local_1644;
    fVar102 = fVar676 * fVar11 * fVar22 * local_1644;
    fVar728 = fVar727 * fVar314;
    fVar103 = fVar728 * fVar10 * fVar23 * v36;
    fVar104 = fVar728 * fVar11 * fVar22 * v36;
    fVar105 = fVar727 * fVar121 * fVar10 * fVar23 * v34;
    fVar252 = fVar727 * fVar121 * fVar11 * fVar22 * v34;
    fVar106 = fVar727 * fVar129 * fVar10 * fVar23 * v33;
    fVar727 = fVar727 * fVar129 * fVar11 * fVar22 * v33;
    fVar253 = fVar586 * fVar136 * fVar11 * fVar23 * v35;
    fVar254 = fVar586 * fVar314 * fVar10 * fVar23 * v35;
    fVar107 = fVar586 * fVar314 * fVar11 * fVar22 * v35;
    fVar255 = fVar586 * fVar137 * fVar10 * fVar23 * v34;
    fVar256 = fVar586 * fVar137 * fVar11 * fVar23 * v33;
    fVar257 = fVar508 * fVar20;
    fVar258 = fVar257 * fVar136 * fVar10 * fVar23 * v35;
    fVar586 = fVar257 * fVar136 * fVar11 * fVar22 * v35;
    fVar259 = fVar257 * fVar314 * fVar10 * fVar22 * v35;
    fVar260 = fVar257 * fVar137 * fVar10 * fVar22 * v34;
    fVar108 = fVar257 * fVar137 * fVar11 * fVar22 * v33;
    fVar109 = fVar349 * fVar16 * fVar314 * fVar11 * fVar24 * v35;
    fVar261 = fVar637 * fVar11 * fVar24 * v34;
    fVar637 = fVar349 * fVar17 * fVar136 * fVar11 * fVar24 * v35;
    fVar349 = fVar349 * fVar17 * fVar137;
    fVar350 = fVar349 * fVar10 * fVar24 * v34;
    fVar349 = fVar349 * fVar11 * fVar24 * v33;
    fVar262 = fVar588 * fVar136 * fVar11 * fVar23 * v35;
    fVar351 = fVar588 * fVar314 * fVar10 * fVar23 * v35;
    fVar263 = fVar588 * fVar314 * fVar11 * fVar22 * v35;
    fVar588 = fVar588 * fVar137 * fVar11;
    fVar352 = fVar588 * fVar22 * v34;
    fVar589 = fVar588 * fVar23 * v33;
    fVar353 = fVar8 + fVar8;
    fVar264 = fVar353 * fVar16 * fVar314 * fVar10 * fVar24 * v35;
    fVar588 = fVar353 * fVar16 * fVar137;
    fVar265 = fVar588 * fVar10 * fVar24 * v34;
    fVar590 = fVar588 * fVar11 * fVar24 * v33;
    fVar266 = fVar353 * fVar17 * fVar136 * fVar10 * fVar24 * v35;
    fVar588 = fVar353 * fVar17 * fVar137;
    fVar110 = fVar588 * fVar10 * fVar24 * v33;
    fVar353 = fVar353 * fVar18;
    fVar591 = fVar353 * fVar136 * fVar10 * fVar23 * v35;
    fVar111 = fVar353 * fVar136 * fVar11 * fVar22 * v35;
    fVar112 = fVar353 * fVar314 * fVar10 * fVar22 * v35;
    fVar354 = fVar353 * fVar137 * fVar10;
    fVar267 = fVar354 * fVar22 * v34;
    fVar355 = fVar354 * fVar23 * v33;
    fVar354 = fVar687 * fVar137 * fVar12;
    fVar268 = fVar354 * fVar22 * local_1648;
    fVar445 = fVar354 * fVar27 * v33;
    fVar688 = fVar687 * fVar135 * fVar12 * fVar22 * v35;
    fVar354 = fVar462 * fVar21 * fVar137 * fVar12 * fVar24 * v33;
    fVar462 = fVar755 * fVar12 * fVar26 * v34;
    fVar687 = fVar755 * fVar14 * fVar24 * v34;
    fVar269 = fVar669 * fVar12 * fVar23 * local_1644;
    fVar669 = fVar669 * fVar14 * fVar23 * v35;
    fVar759 = fVar758 * fVar23 * v34;
    fVar403 = fVar403 * fVar23 * v34;
    fVar270 = fVar656 * fVar10 * fVar24 * local_1648;
    fVar656 = fVar656 * fVar15 * fVar24 * v33;
    fVar271 = fVar347 * fVar135 * fVar10 * fVar24 * v35;
    fVar347 = fVar407 * fVar314 * fVar11;
    fVar272 = fVar347 * fVar24 * local_1644;
    fVar273 = fVar347 * fVar26 * v35;
    fVar347 = fVar407 * fVar129 * fVar11 * fVar24 * v34;
    fVar755 = fVar676 * fVar10 * fVar27 * v35;
    fVar274 = fVar676 * fVar15 * fVar22 * v35;
    fVar275 = fVar257 * fVar314 * fVar11 * fVar23 * v35;
    fVar276 = fVar508 * fVar21 * fVar136 * fVar10 * fVar24 * v35;
    fVar588 = fVar588 * fVar11 * fVar24 * v34;
    fVar277 = fVar353 * fVar314 * fVar11 * fVar23 * v35;
    fVar257 = fVar9 + fVar9;
    fVar353 = fVar257 * fVar16 * fVar137 * fVar12 * fVar24 * v33;
    fVar676 = fVar257 * fVar18 * fVar136 * fVar12 * fVar22 * v35;
    fVar758 = fVar467 * fVar137 * fVar12;
    fVar113 = fVar758 * fVar23 * local_1648;
    fVar278 = fVar758 * fVar27 * v34;
    fVar468 = fVar467 * fVar135 * fVar12 * fVar23 * v35;
    fVar617 = fVar616 * fVar21 * fVar137 * fVar12 * fVar24 * v34;
    fVar547 = fVar781 * fVar11 * fVar24 * local_1648;
    fVar782 = fVar781 * fVar15 * fVar24 * v34;
    fVar408 = fVar407 * fVar135 * fVar11 * fVar24 * v35;
    fVar678 = fVar728 * fVar11 * fVar27 * v35;
    fVar729 = fVar728 * fVar15 * fVar23 * v35;
    fVar509 = fVar508 * fVar21 * fVar314 * fVar11 * fVar24 * v35;
    fVar758 = fVar257 * fVar17 * fVar137 * fVar12 * fVar24 * v34;
    fVar279 = fVar257 * fVar18 * fVar314 * fVar12 * fVar23 * v35;
    fVar257 = fVar4 * fVar16 * fVar314;
    fVar510 = fVar257 * fVar12 * fVar25 * v35;
    fVar469 = fVar257 * fVar13 * fVar24 * v35;
    fVar257 = fVar4 * fVar16 * fVar137;
    fVar548 = fVar257 * fVar12 * fVar25 * v34;
    fVar257 = fVar257 * fVar13 * fVar24 * v34;
    fVar407 = fVar4 * fVar17;
    fVar470 = fVar407 * fVar136 * fVar12 * fVar24 * v36;
    fVar356 = fVar407 * fVar136 * fVar13 * fVar24 * v35;
    fVar357 = fVar407 * fVar137 * fVar13 * fVar24 * v33;
    fVar467 = fVar407 * fVar121 * fVar12 * fVar24 * v33;
    fVar358 = fVar4 * fVar18;
    fVar471 = fVar358 * fVar136 * fVar12 * fVar23 * v36;
    fVar359 = fVar358 * fVar136 * fVar13 * fVar23 * v35;
    fVar508 = fVar358 * fVar314 * fVar13 * fVar22 * v35;
    fVar616 = fVar358 * fVar137 * fVar13;
    fVar280 = fVar616 * fVar22 * v34;
    fVar616 = fVar616 * fVar23 * v33;
    fVar728 = fVar358 * fVar121 * fVar12 * fVar23 * v33;
    fVar549 = fVar4 * fVar19 * fVar314 * fVar12 * fVar22 * v35;
    fVar781 = fVar4 * fVar19 * fVar137 * fVar12 * fVar22 * v34;
    fVar281 = fVar5 * fVar16;
    fVar282 = fVar281 * fVar136 * fVar12;
    fVar360 = fVar282 * fVar24 * v36;
    fVar283 = fVar282 * fVar25 * v35;
    fVar282 = fVar281 * fVar137 * fVar12;
    fVar114 = fVar282 * fVar25 * v33;
    fVar115 = fVar281 * fVar121 * fVar12 * fVar24 * v33;
    fVar550 = fVar5 * fVar18;
    fVar116 = fVar550 * fVar136 * fVar12;
    fVar117 = fVar116 * fVar22 * v36;
    fVar284 = fVar550 * fVar121 * fVar12 * fVar22 * v33;
    fVar118 = fVar5 * fVar19 * fVar136 * fVar12 * fVar22 * v35;
    fVar361 = fVar5 * fVar19 * fVar137 * fVar12 * fVar22 * v33;
    fVar679 = fVar6 * fVar16;
    fVar618 = fVar679 * fVar136 * fVar11;
    fVar362 = fVar618 * fVar24 * v36;
    fVar619 = fVar618 * fVar25 * v35;
    fVar620 = fVar679 * fVar314;
    fVar621 = fVar620 * fVar10 * fVar25 * v35;
    fVar363 = fVar679 * fVar137;
    fVar618 = fVar363 * fVar10 * fVar25 * v34;
    fVar364 = fVar363 * fVar11 * fVar25 * v33;
    fVar622 = fVar679 * fVar121 * fVar11 * fVar24 * v33;
    fVar639 = fVar6 * fVar17;
    fVar365 = fVar639 * fVar136;
    fVar366 = fVar365 * fVar10 * fVar24 * v36;
    fVar367 = fVar639 * fVar121 * fVar10 * fVar24 * v33;
    fVar368 = fVar6 * fVar18;
    fVar511 = fVar368 * fVar136;
    fVar730 = fVar511 * fVar10 * fVar23 * v36;
    fVar119 = fVar511 * fVar11 * fVar22 * v36;
    fVar120 = fVar368 * fVar121 * fVar10 * fVar23 * v33;
    fVar285 = fVar368 * fVar121 * fVar11 * fVar22 * v33;
    fVar286 = fVar6 * fVar19;
    fVar472 = fVar286 * fVar136 * fVar11 * fVar22 * v35;
    fVar473 = fVar286 * fVar314 * fVar10 * fVar22 * v35;
    fVar121 = fVar286 * fVar137 * fVar10 * fVar22 * v34;
    fVar287 = fVar286 * fVar137 * fVar11 * fVar22 * v33;
    fVar731 = fVar7 * fVar16 * fVar314 * fVar10 * fVar24 * v35;
    fVar288 = fVar7 * fVar16 * fVar137 * fVar10 * fVar24 * v34;
    fVar289 = fVar7 * fVar17 * fVar136 * fVar10 * fVar24 * v35;
    fVar286 = fVar7 * fVar17 * fVar137 * fVar10 * fVar24 * v33;
    fVar474 = fVar7 * fVar18;
    fVar732 = fVar474 * fVar136 * fVar10 * fVar23 * v35;
    fVar122 = fVar474 * fVar314 * fVar10 * fVar22 * v35;
    fVar475 = fVar474 * fVar137 * fVar10;
    fVar474 = fVar475 * fVar22 * v34;
    fVar476 = fVar475 * fVar23 * v33;
    fVar475 = fVar407 * fVar314 * fVar12;
    fVar733 = fVar475 * fVar24 * local_1644;
    fVar477 = fVar475 * fVar26 * v35;
    fVar592 = fVar407 * fVar137 * fVar12;
    fVar593 = fVar592 * fVar26 * v34;
    fVar478 = fVar407 * fVar129 * fVar12 * fVar24 * v34;
    fVar290 = fVar358 * fVar314 * fVar12;
    fVar291 = fVar290 * fVar23 * local_1644;
    fVar292 = fVar358 * fVar129 * fVar12 * fVar23 * v34;
    fVar594 = fVar4 * fVar20 * fVar314 * fVar12 * fVar23 * v35;
    fVar293 = fVar4 * fVar20 * fVar137 * fVar12 * fVar23 * v34;
    fVar479 = fVar281 * fVar314 * fVar12 * fVar24 * local_1644;
    fVar734 = fVar281 * fVar314 * fVar14 * fVar24 * v35;
    fVar475 = fVar281 * fVar137 * fVar14 * fVar24 * v34;
    fVar595 = fVar281 * fVar129 * fVar12 * fVar24 * v34;
    fVar596 = fVar5 * fVar17 * fVar136;
    fVar480 = fVar596 * fVar12 * fVar26 * v35;
    fVar597 = fVar596 * fVar14 * fVar24 * v35;
    fVar596 = fVar5 * fVar17 * fVar137;
    fVar598 = fVar596 * fVar12 * fVar26 * v33;
    fVar294 = fVar596 * fVar14 * fVar24 * v33;
    fVar551 = fVar550 * fVar136 * fVar14 * fVar23 * v35;
    fVar481 = fVar550 * fVar314 * fVar12 * fVar22 * local_1644;
    fVar295 = fVar550 * fVar314 * fVar14 * fVar22 * v35;
    fVar296 = fVar550 * fVar137 * fVar14;
    fVar596 = fVar296 * fVar22 * v34;
    fVar297 = fVar296 * fVar23 * v33;
    fVar298 = fVar550 * fVar129 * fVar12 * fVar22 * v34;
    fVar552 = fVar5 * fVar20 * fVar136 * fVar12 * fVar23 * v35;
    fVar296 = fVar5 * fVar20 * fVar137 * fVar12 * fVar23 * v33;
    fVar123 = fVar620 * fVar11 * fVar24 * local_1644;
    fVar553 = fVar679 * fVar129 * fVar11 * fVar24 * v34;
    fVar124 = fVar365 * fVar11 * fVar26 * v35;
    fVar125 = fVar639 * fVar314 * fVar10;
    fVar299 = fVar125 * fVar24 * local_1644;
    fVar125 = fVar125 * fVar26 * v35;
    fVar554 = fVar639 * fVar137;
    fVar482 = fVar554 * fVar10 * fVar26 * v34;
    fVar483 = fVar554 * fVar11 * fVar26 * v33;
    fVar126 = fVar639 * fVar129 * fVar10 * fVar24 * v34;
    fVar484 = fVar368 * fVar314;
    fVar127 = fVar484 * fVar10 * fVar23 * local_1644;
    fVar128 = fVar484 * fVar11 * fVar22 * local_1644;
    fVar300 = fVar368 * fVar129 * fVar10 * fVar23 * v34;
    fVar129 = fVar368 * fVar129 * fVar11 * fVar22 * v34;
    fVar301 = fVar6 * fVar20;
    fVar302 = fVar301 * fVar136 * fVar11 * fVar23 * v35;
    fVar303 = fVar301 * fVar314 * fVar10 * fVar23 * v35;
    fVar130 = fVar301 * fVar137 * fVar10 * fVar23 * v34;
    fVar301 = fVar301 * fVar137 * fVar11 * fVar23 * v33;
    fVar131 = fVar8 * fVar16 * fVar314 * fVar11 * fVar24 * v35;
    fVar304 = fVar8 * fVar16 * fVar137 * fVar11 * fVar24 * v34;
    fVar305 = fVar8 * fVar17 * fVar136 * fVar11 * fVar24 * v35;
    fVar306 = fVar8 * fVar17 * fVar137 * fVar11 * fVar24 * v33;
    fVar132 = fVar8 * fVar18;
    fVar133 = fVar132 * fVar136 * fVar11 * fVar23 * v35;
    fVar307 = fVar132 * fVar314 * fVar11 * fVar22 * v35;
    fVar132 = fVar132 * fVar137 * fVar11;
    fVar308 = fVar132 * fVar22 * v34;
    fVar132 = fVar132 * fVar23 * v33;
    fVar592 = fVar592 * fVar24 * local_1648;
    fVar309 = fVar407 * fVar135 * fVar12 * fVar24 * v35;
    fVar407 = fVar290 * fVar27 * v35;
    fVar290 = fVar358 * fVar137 * fVar12;
    fVar134 = fVar290 * fVar23 * local_1648;
    fVar290 = fVar290 * fVar27 * v34;
    fVar310 = fVar358 * fVar135 * fVar12 * fVar23 * v35;
    fVar358 = fVar4 * fVar21 * fVar314 * fVar12 * fVar24 * v35;
    fVar409 = fVar4 * fVar21 * fVar137 * fVar12 * fVar24 * v34;
    fVar282 = fVar282 * fVar24 * local_1648;
    fVar311 = fVar281 * fVar135 * fVar12 * fVar24 * v35;
    fVar116 = fVar116 * fVar27 * v35;
    fVar281 = fVar550 * fVar137 * fVar12;
    fVar410 = fVar281 * fVar22 * local_1648;
    fVar312 = fVar281 * fVar27 * v33;
    fVar281 = fVar550 * fVar135 * fVar12 * fVar22 * v35;
    fVar411 = fVar5 * fVar21 * fVar136 * fVar12 * fVar24 * v35;
    fVar313 = fVar5 * fVar21 * fVar137 * fVar12 * fVar24 * v33;
    fVar550 = fVar620 * fVar15 * fVar24 * v35;
    fVar620 = fVar363 * fVar11 * fVar24 * local_1648;
    fVar363 = fVar363 * fVar15 * fVar24 * v34;
    fVar680 = fVar679 * fVar135 * fVar11 * fVar24 * v35;
    fVar365 = fVar365 * fVar15 * fVar24 * v35;
    fVar735 = fVar554 * fVar10 * fVar24 * local_1648;
    fVar555 = fVar554 * fVar15 * fVar24 * v33;
    fVar640 = fVar639 * fVar135 * fVar10 * fVar24 * v35;
    fVar623 = fVar511 * fVar11 * fVar27 * v35;
    fVar512 = fVar511 * fVar15 * fVar23 * v35;
    fVar599 = fVar484 * fVar10 * fVar27 * v35;
    fVar485 = fVar484 * fVar15 * fVar22 * v35;
    fVar484 = fVar368 * fVar137;
    fVar556 = fVar484 * fVar10 * fVar23 * local_1648;
    fVar513 = fVar484 * fVar10 * fVar27 * v34;
    fVar600 = fVar484 * fVar11 * fVar22 * local_1648;
    fVar514 = fVar484 * fVar11 * fVar27 * v33;
    fVar679 = fVar484 * fVar15 * fVar22 * v34;
    fVar486 = fVar484 * fVar15 * fVar23 * v33;
    fVar484 = fVar368 * fVar135 * fVar10 * fVar23 * v35;
    fVar639 = fVar368 * fVar135 * fVar11 * fVar22 * v35;
    fVar554 = fVar6 * fVar21;
    fVar368 = fVar554 * fVar136 * fVar11 * fVar24 * v35;
    fVar511 = fVar554 * fVar314 * fVar10 * fVar24 * v35;
    fVar135 = fVar554 * fVar137 * fVar10 * fVar24 * v34;
    fVar783 = fVar554 * fVar137 * fVar11 * fVar24 * v33;
    fVar689 = fVar9 * fVar16 * fVar314 * fVar12 * fVar24 * v35;
    fVar601 = fVar9 * fVar16 * fVar137 * fVar12 * fVar24 * v34;
    fVar760 = fVar9 * fVar17 * fVar136 * fVar12 * fVar24 * v35;
    fVar602 = fVar9 * fVar17 * fVar137 * fVar12 * fVar24 * v33;
    fVar554 = fVar9 * fVar18;
    fVar446 = fVar554 * fVar136 * fVar12 * fVar23 * v35;
    fVar603 = fVar554 * fVar314 * fVar12 * fVar22 * v35;
    fVar314 = fVar554 * fVar137 * fVar12;
    fVar136 = fVar314 * fVar22 * v34;
    fVar314 = fVar314 * fVar23 * v33;
    Eigen::Matrix<float,_5,_1,_0,_5,_1>::Matrix
              ((Matrix<float,_5,_1,_0,_5,_1> *)
               &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pSVar35 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0,0);
    *pSVar35 = (fVar561 +
               fVar415 + ((((fVar569 +
                            fVar681 + fVar761 + (((fVar183 +
                                                  ((fVar487 +
                                                   ((fVar371 +
                                                    fVar498 + (((fVar518 +
                                                                fVar567 + (((fVar448 +
                                                                            fVar605 + ((fVar629 +
                                                                                       (((fVar692 +
                                                                                         ((fVar44 + 
                                                  fVar370 + fVar180 + ((fVar141 +
                                                                       ((fVar178 +
                                                                        (((((fVar557 +
                                                                            ((fVar173 +
                                                                             ((fVar38 + fVar171 + 
                                                  fVar62 + (((fVar63 + fVar170 + fVar61 + ((((
                                                  fVar167 + fVar60 + ((fVar164 +
                                                                      ((fVar162 +
                                                                       ((((fVar565 +
                                                                          fVar56 + (((fVar646 +
                                                                                     fVar54 + (((
                                                  fVar160 + fVar52 + (((fVar159 +
                                                                       fVar564 + fVar157 + ((fVar158
                                                                                            + ((
                                                  fVar627 + (((fVar156 +
                                                              fVar493 + fVar155 + ((((fVar625 +
                                                                                     fVar644 + ((
                                                  fVar491 + (((fVar50 + fVar149 + fVar49 + ((((
                                                  fVar642 + fVar48 + ((fVar489 +
                                                                      ((fVar145 +
                                                                       ((((fVar488 +
                                                                          ((fVar322 +
                                                                           fVar45 + ((fVar690 +
                                                                                     (((fVar144 +
                                                                                       fVar41 + 
                                                  fVar143 + (((fVar558 +
                                                              fVar320 + fVar140 + ((fVar559 +
                                                                                   (((fVar40 + (((
                                                  fVar318 + fVar413 + (((fVar317 +
                                                                        (fVar412 - fVar316)) -
                                                                       fVar315) - fVar515)) - fVar39
                                                  ) - fVar369)) - fVar319) - fVar138)) - fVar139)) -
                                                  fVar142) - fVar562)) - fVar321) - fVar42)) -
                                                  fVar43)) - fVar46)) - fVar324) - fVar325) -
                                                  fVar447)) - fVar641)) - fVar47)) - fVar147) -
                                                  fVar148) - fVar146)) - fVar150) - fVar151)) -
                                                  fVar490)) - fVar492) - fVar153) - fVar154)) -
                                                  fVar626) - fVar643)) - fVar645)) - fVar628)) -
                                                  fVar51) - fVar494)) - fVar495) - fVar53)) - fVar55
                                                  ) - fVar161)) - fVar57) - fVar58) - fVar59)) -
                                                  fVar163)) - fVar166)) - fVar165) - fVar168) -
                                                  fVar169)) - fVar64) - fVar65)) - fVar172)) -
                                                  fVar152)) - fVar174) - fVar175) - fVar176) -
                                                  fVar177)) - fVar560)) - fVar179)) - fVar181)) -
                                                  fVar182) - fVar323)) - fVar648)) - fVar517) -
                                                  fVar496)) - fVar497) - fVar568)) - fVar449)) -
                                                  fVar327)) - fVar326) - fVar516)) - fVar736) -
                          fVar682) - fVar414)) - fVar184;
    pSVar35 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,1,0);
    *pSVar35 = (fVar85 + fVar500 + ((fVar654 +
                                    ((fVar772 +
                                     (((fVar457 +
                                       ((fVar86 + ((fVar762 +
                                                   fVar332 + ((fVar210 +
                                                              (((fVar209 +
                                                                fVar703 + ((fVar208 +
                                                                           ((fVar70 + ((fVar744 +
                                                                                       ((fVar528 +
                                                                                        (((fVar204 +
                                                                                          ((fVar684 
                                                  + ((fVar428 +
                                                     fVar334 + (((fVar202 +
                                                                 fVar425 + fVar575 + fVar83 + (((((
                                                  fVar201 + fVar331 + fVar200 + (((((fVar422 +
                                                                                    fVar82 + ((
                                                  fVar572 + fVar81 + (((fVar571 +
                                                                       ((((fVar193 +
                                                                          fVar709 + (((fVar78 + 
                                                  fVar77 + (((fVar653 +
                                                             ((fVar74 + fVar707 + ((fVar191 +
                                                                                   fVar537 + (((
                                                  fVar770 + ((fVar73 + fVar651 + fVar381 + ((fVar72 
                                                  + (((fVar380 +
                                                      ((fVar534 +
                                                       fVar650 + ((((fVar530 +
                                                                    fVar742 + fVar375 + fVar533 + ((
                                                  (fVar69 + (((fVar529 +
                                                              fVar67 + fVar527 + (((fVar704 +
                                                                                   ((fVar455 +
                                                                                    ((fVar694 +
                                                                                     ((((fVar454 +
                                                                                        fVar701 + ((
                                                  fVar740 + fVar453 + ((fVar521 +
                                                                       fVar450 + fVar452 + (((((
                                                  fVar373 + ((fVar607 +
                                                             fVar739 + fVar697 + ((((fVar606 +
                                                                                    ((fVar66 + (((
                                                  fVar768 + fVar691 + fVar766 + (((fVar765 +
                                                                                  fVar185 + ((
                                                  fVar630 + ((fVar693 +
                                                             (((fVar763 +
                                                               ((fVar418 +
                                                                fVar328 + ((fVar417 +
                                                                           ((fVar372 - fVar563) -
                                                                           fVar416)) - fVar374)) -
                                                               fVar566)) - fVar419) - fVar604)) -
                                                            fVar764)) - fVar624)) - fVar647) -
                                                  fVar186)) - fVar187) - fVar767)) - fVar695)) -
                                                  fVar738) - fVar769) - fVar696)) - fVar698)) -
                                                  fVar699) - fVar608) - fVar520) - fVar451)) -
                                                  fVar700)) - fVar522)) - fVar702) - fVar523) -
                                                  fVar524)) - fVar525)) - fVar737)) - fVar741) -
                                                  fVar526)) - fVar68) - fVar705)) - fVar706) -
                                                  fVar531)) - fVar376) - fVar377) - fVar378)) -
                                                  fVar379)) - fVar649) - fVar71)) - fVar188)) -
                                                  fVar190)) - fVar535) - fVar189)) - fVar536)) -
                                                  fVar708)) - fVar75) - fVar76)) - fVar192) - fVar79
                                                  )) - fVar194) - fVar195) - fVar80)) - fVar197) -
                                                  fVar570)) - fVar198)) - fVar421) - fVar573) -
                                                  fVar199) - fVar330)) - fVar420) - fVar423) -
                                                  fVar424) - fVar329)) - fVar426) - fVar427)) -
                                                  fVar333)) - fVar203)) - fVar519) - fVar683)) -
                                                  fVar205)) - fVar206)) - fVar207)) - fVar532)) -
                                                  fVar652) - fVar196)) - fVar574)) - fVar84)) -
                                       fVar211)) - fVar610) - fVar538)) - fVar383)) - fVar711)) -
               fVar212;
    pSVar35 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,2,0);
    *pSVar35 = (fVar341 +
               ((fVar438 +
                fVar612 + (((fVar245 +
                            ((fVar391 +
                             fVar461 + (((fVar507 +
                                         ((fVar582 +
                                          fVar436 + fVar390 + (((((fVar459 +
                                                                  fVar540 + fVar244 + fVar635 + ((((
                                                  fVar718 + ((fVar774 +
                                                             (((fVar99 + fVar771 + fVar241 + fVar340
                                                                                             + (((
                                                  fVar98 + ((fVar97 + fVar217 + (((fVar609 +
                                                                                  ((fVar577 +
                                                                                   fVar576 + ((((
                                                  fVar94 + fVar93 + fVar234 + ((((fVar92 + (((
                                                  fVar230 + fVar228 + fVar655 + (((fVar432 +
                                                                                  ((fVar226 +
                                                                                   fVar430 + ((
                                                  fVar89 + ((fVar634 +
                                                            ((((fVar745 +
                                                               fVar714 + (((fVar88 + fVar713 + 
                                                  fVar222 + ((fVar712 +
                                                             fVar710 + ((((fVar339 +
                                                                          fVar218 + ((fVar338 +
                                                                                     ((fVar216 +
                                                                                      ((fVar578 +
                                                                                       (((fVar499 +
                                                                                         fVar213 + (
                                                  (((fVar434 +
                                                    fVar503 + fVar337 + ((((fVar385 +
                                                                           fVar502 + ((fVar431 +
                                                                                      fVar458 + ((
                                                  fVar384 - fVar501) - fVar429)) - fVar743)) -
                                                  fVar433) - fVar335) - fVar336)) - fVar456) -
                                                  fVar504) - fVar505)) - fVar387) - fVar214)) -
                                                  fVar215)) - fVar579)) - fVar580)) - fVar219) -
                                                  fVar220) - fVar221)) - fVar87)) - fVar223) -
                                                  fVar632)) - fVar715) - fVar716) - fVar224)) -
                                                  fVar633)) - fVar90)) - fVar382)) - fVar91) -
                                                  fVar386)) - fVar227) - fVar229)) - fVar231) -
                                                  fVar232) - fVar233)) - fVar235) - fVar236) -
                                                  fVar388)) - fVar95)) - fVar237) - fVar238)) -
                                                  fVar239)) - fVar240) - fVar96)) - fVar242) -
                                                  fVar243)) - fVar717)) - fVar747) - fVar748) -
                                                  fVar749)) - fVar225) - fVar686) - fVar657) -
                                                  fVar506)) - fVar342)) - fVar460) - fVar583)) -
                            fVar437)) - fVar343) - fVar631)) - fVar613)) - fVar246;
    pSVar35 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,3,0);
    *pSVar35 = (fVar758 +
               fVar509 + ((fVar678 +
                          ((fVar782 +
                           (((fVar468 +
                             ((fVar113 +
                              ((fVar353 +
                               ((fVar588 +
                                fVar276 + fVar275 + ((fVar755 +
                                                     ((fVar273 +
                                                      (((fVar656 +
                                                        (((fVar759 +
                                                          ((fVar269 +
                                                           fVar687 + (((fVar688 +
                                                                       ((fVar268 +
                                                                        fVar355 + ((fVar112 +
                                                                                   ((((fVar266 +
                                                                                      fVar590 + 
                                                  fVar265 + (((fVar352 +
                                                              (((fVar262 +
                                                                fVar349 + fVar350 + (((fVar109 +
                                                                                      ((fVar260 +
                                                                                       ((fVar586 +
                                                                                        fVar258 + 
                                                  fVar256 + ((fVar107 +
                                                             fVar254 + ((fVar727 +
                                                                        (((fVar105 +
                                                                          fVar104 + (((fVar677 +
                                                                                      fVar101 + ((((
                                                  fVar726 + ((fVar546 +
                                                             fVar777 + ((fVar778 +
                                                                        ((((fVar249 +
                                                                           fVar746 + ((fVar405 +
                                                                                      ((fVar611 +
                                                                                       (((fVar543 +
                                                                                         fVar404 + (
                                                  (((fVar542 +
                                                    ((fVar672 +
                                                     fVar757 + fVar400 + ((fVar671 +
                                                                          ((((fVar399 +
                                                                             fVar723 + ((fVar756 +
                                                                                        fVar398 + ((
                                                  fVar465 + ((fVar397 +
                                                             fVar665 + ((((fVar722 +
                                                                          fVar663 + ((((fVar395 +
                                                                                       fVar614 + ((
                                                  fVar394 + fVar662 + (((fVar720 +
                                                                        (((fVar753 +
                                                                          fVar659 + fVar719 + (((
                                                  fVar443 + fVar776 + fVar442 + (((fVar441 +
                                                                                  (((fVar775 +
                                                                                    ((fVar389 +
                                                                                     fVar247 + (((
                                                  fVar638 + fVar587 + ((fVar348 +
                                                                       (((fVar584 +
                                                                         ((fVar541 +
                                                                          (fVar344 - fVar392)) -
                                                                         fVar345)) - fVar346) -
                                                                       fVar636)) - fVar585)) -
                                                  fVar750) - fVar751)) - fVar439)) - fVar440) -
                                                  fVar435)) - fVar248) - fVar539)) - fVar752) -
                                                  fVar658)) - fVar660) - fVar444)) - fVar661) -
                                                  fVar393)) - fVar463)) - fVar615) - fVar464) -
                                                  fVar721)) - fVar396) - fVar754) - fVar664)) -
                                                  fVar666)) - fVar667)) - fVar466)) - fVar724) -
                                                  fVar668) - fVar670)) - fVar725)) - fVar401)) -
                                                  fVar673) - fVar402) - fVar674)) - fVar581) -
                                                  fVar675)) - fVar544)) - fVar685)) - fVar406) -
                                                  fVar773) - fVar545)) - fVar250)) - fVar780)) -
                                                  fVar779) - fVar251) - fVar100)) - fVar102) -
                                                  fVar103)) - fVar252) - fVar106)) - fVar253)) -
                                                  fVar255)) - fVar259)) - fVar108)) - fVar261) -
                                                  fVar637)) - fVar351) - fVar263)) - fVar589) -
                                                  fVar264)) - fVar110) - fVar591) - fVar111)) -
                                                  fVar267)) - fVar445)) - fVar354) - fVar462)) -
                                                  fVar669)) - fVar403) - fVar270)) - fVar271) -
                                                  fVar272)) - fVar347)) - fVar274)) - fVar277)) -
                              fVar676)) - fVar278)) - fVar617) - fVar547)) - fVar408)) - fVar729)) -
               fVar279;
    pSVar35 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,4,0);
    *pSVar35 = (fVar136 +
               ((fVar446 +
                fVar602 + (((fVar689 +
                            fVar783 + ((fVar511 +
                                       (((fVar484 +
                                         ((fVar679 +
                                          fVar514 + (((fVar556 +
                                                      ((fVar599 +
                                                       fVar512 + (((fVar555 +
                                                                   (((fVar680 +
                                                                     ((fVar620 +
                                                                      fVar550 + ((fVar411 +
                                                                                 fVar281 + ((fVar410
                                                                                            + 
                                                  fVar116 + (((fVar409 +
                                                              (((fVar290 +
                                                                (((fVar309 +
                                                                  fVar592 + ((fVar308 +
                                                                             ((fVar133 +
                                                                              fVar306 + (((fVar131 +
                                                                                          fVar301 + 
                                                  ((fVar303 +
                                                   (((fVar300 +
                                                     ((fVar127 +
                                                      ((fVar483 +
                                                       ((fVar125 +
                                                        (((fVar553 +
                                                          fVar123 + ((fVar552 +
                                                                     fVar298 + ((fVar596 +
                                                                                ((fVar481 +
                                                                                 fVar551 + fVar294 +
                                                                                           (((
                                                  fVar480 + (((fVar734 +
                                                              ((fVar293 +
                                                               ((((fVar478 +
                                                                  fVar593 + ((fVar733 +
                                                                             ((fVar474 +
                                                                              ((fVar732 +
                                                                               fVar286 + (((fVar731 
                                                  + fVar287 + ((fVar473 +
                                                               (((fVar120 +
                                                                 ((fVar730 +
                                                                  (((fVar622 +
                                                                    fVar364 + ((fVar621 +
                                                                               ((fVar362 +
                                                                                ((fVar118 +
                                                                                 fVar284 + fVar117 +
                                                                                           (((
                                                  fVar283 + ((fVar781 +
                                                             ((((fVar280 +
                                                                ((fVar359 +
                                                                 ((fVar467 +
                                                                  fVar357 + ((fVar470 +
                                                                             ((fVar548 +
                                                                              (fVar469 - fVar510)) -
                                                                             fVar257)) - fVar356)) -
                                                                 fVar471)) - fVar508)) - fVar616) -
                                                              fVar728) - fVar549)) - fVar360)) -
                                                  fVar114) - fVar115)) - fVar361)) - fVar619)) -
                                                  fVar618)) - fVar366) - fVar367)) - fVar119)) -
                                                  fVar285) - fVar472)) - fVar121)) - fVar288) -
                                                  fVar289)) - fVar122)) - fVar476)) - fVar477)) -
                                                  fVar291) - fVar292) - fVar594)) - fVar479)) -
                                                  fVar475) - fVar595)) - fVar597) - fVar598)) -
                                                  fVar295)) - fVar297)) - fVar296)) - fVar124) -
                                                  fVar299)) - fVar482)) - fVar126)) - fVar128)) -
                                                  fVar129) - fVar302)) - fVar130)) - fVar304) -
                                                  fVar305)) - fVar307)) - fVar132)) - fVar407) -
                                                  fVar134)) - fVar310) - fVar358)) - fVar282) -
                                                  fVar311)) - fVar312)) - fVar313)) - fVar363)) -
                                                  fVar365) - fVar735)) - fVar640) - fVar623)) -
                                                  fVar485)) - fVar513) - fVar600)) - fVar486)) -
                                        fVar639) - fVar368)) - fVar135)) - fVar601) - fVar760)) -
               fVar603)) - fVar314;
    o4_roots<float>((vector<float,_std::allocator<float>_> *)&sTheta1,
                    (Matrix<float,_5,_1,_0,_5,_1> *)
                    &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    if ((tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
         _3_1_ & 1) != 0) {
      poVar29 = std::operator<<((ostream *)&std::cout,"[VERBOSE] The number of valid solutions is: "
                               );
      sVar28 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)&sTheta1);
      this_18 = (void *)std::ostream::operator<<(poVar29,sVar28);
      std::ostream::operator<<(this_18,std::endl<char,std::char_traits<char>>);
    }
    Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)&numSolutions);
    iter._3_1_ = 0;
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::vector(__return_storage_ptr__);
    sVar28 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)&sTheta1);
    local_1710 = (uint)sVar28;
    for (local_1714 = 0; local_1714 < local_1710; local_1714 = local_1714 + 1) {
      pvVar36 = std::vector<float,_std::allocator<float>_>::back
                          ((vector<float,_std::allocator<float>_> *)&sTheta1);
      sTheta2 = *pvVar36;
      std::vector<float,_std::allocator<float>_>::pop_back
                ((vector<float,_std::allocator<float>_> *)&sTheta1);
      shouldBeZero1 = (1.0 - sTheta2 * sTheta2) / (sTheta2 * sTheta2 + 1.0);
      shouldBeZero2 = (sTheta2 + sTheta2) / (sTheta2 * sTheta2 + 1.0);
      fVar490 = fVar6 * fVar18;
      fVar47 = shouldBeZero1 * fVar4 * fVar18;
      fVar136 = shouldBeZero1 * fVar6;
      fVar49 = fVar136 * fVar16;
      fVar558 = shouldBeZero1 * fVar5 * fVar18;
      fVar39 = fVar136 * fVar17 * fVar10;
      fVar48 = fVar47 * fVar12;
      fVar46 = shouldBeZero2 * fVar4 * fVar18;
      fVar42 = shouldBeZero2 * fVar5 * fVar18;
      fVar44 = shouldBeZero2 * fVar6;
      fVar146 = fVar44 * fVar16 * fVar10;
      fVar45 = fVar44 * fVar17;
      fVar43 = fVar42 * fVar12;
      fVar135 = shouldBeZero1 * shouldBeZero1;
      fVar141 = fVar135 * fVar4;
      fVar40 = fVar141 * fVar17 * fVar12;
      fVar41 = fVar135 * fVar5 * fVar16;
      fVar314 = shouldBeZero2 * shouldBeZero2;
      fVar137 = fVar314 * fVar4 * fVar17;
      fVar315 = fVar314 * fVar5;
      fVar38 = fVar315 * fVar16 * fVar12;
      fVar50 = shouldBeZero1 * shouldBeZero2;
      fVar121 = fVar50 * fVar4;
      fVar129 = fVar50 * fVar5;
      a = -((fVar129 * fVar20 * fVar12 * fVar23 +
            ((fVar129 * fVar17 * fVar12 * fVar26 +
             (((fVar50 * fVar7 * fVar16 * fVar11 * fVar24 +
               fVar129 * fVar19 * fVar12 * fVar22 +
               ((fVar129 * fVar16 * fVar12 * fVar25 +
                fVar121 * fVar20 * fVar12 * fVar22 +
                (((fVar121 * fVar17 * fVar12 * fVar25 +
                  fVar121 * fVar16 * fVar14 * fVar24 +
                  ((fVar314 * fVar8 * fVar17 * fVar10 * fVar24 +
                   (((fVar315 * fVar19 * fVar12 * fVar23 +
                     fVar315 * fVar17 * fVar13 * fVar24 +
                     ((fVar38 * fVar26 +
                      ((fVar135 * fVar8 * fVar16 * fVar11 * fVar24 +
                       fVar41 * fVar14 * fVar24 +
                       (((fVar135 * fVar7 * fVar16 * fVar10 * fVar24 +
                         ((fVar141 * fVar16 * fVar13 * fVar24 +
                          ((((shouldBeZero2 * fVar5 * fVar21 * fVar12 * fVar24 +
                             fVar43 * fVar27 +
                             shouldBeZero2 * fVar8 * fVar18 * fVar10 * fVar22 +
                             (((fVar44 * fVar19 * fVar10 * fVar23 +
                               ((fVar146 * fVar26 +
                                fVar42 * fVar13 * fVar22 +
                                ((shouldBeZero1 * fVar9 * fVar16 * fVar12 * fVar24 +
                                 fVar49 * fVar15 * fVar24 +
                                 ((((fVar136 * fVar20 * fVar10 * fVar23 +
                                    fVar39 * fVar26 +
                                    (((fVar136 * fVar19 * fVar10 * fVar22 +
                                      fVar49 * fVar10 * fVar25 +
                                      (((fVar6 * fVar21 * fVar10 * fVar24 +
                                        (fVar490 * fVar10 * fVar27 - fVar490 * fVar15 * fVar22)) -
                                       fVar9 * fVar18 * fVar12 * fVar22) - fVar47 * fVar13 * fVar22)
                                      ) - shouldBeZero1 * fVar7 * fVar18 * fVar10 * fVar22) -
                                    fVar558 * fVar14 * fVar22)) -
                                   shouldBeZero1 * fVar8 * fVar18 * fVar11 * fVar22) -
                                  fVar48 * fVar27) -
                                 shouldBeZero1 * fVar4 * fVar21 * fVar12 * fVar24)) -
                                fVar46 * fVar14 * fVar22)) - fVar45 * fVar10 * fVar25)) -
                              fVar44 * fVar20 * fVar10 * fVar22) -
                             shouldBeZero2 * fVar7 * fVar18 * fVar11 * fVar22)) -
                            fVar45 * fVar15 * fVar24) -
                           shouldBeZero2 * fVar9 * fVar17 * fVar12 * fVar24) -
                          fVar141 * fVar16 * fVar12 * fVar25)) - fVar141 * fVar19 * fVar12 * fVar22)
                         ) - fVar40 * fVar26) - fVar141 * fVar20 * fVar12 * fVar23)) -
                      fVar137 * fVar14 * fVar24)) - fVar315 * fVar17 * fVar12 * fVar25)) -
                    fVar315 * fVar20 * fVar12 * fVar22) - fVar314 * fVar7 * fVar17 * fVar11 * fVar24
                   )) - fVar121 * fVar16 * fVar12 * fVar26)) - fVar121 * fVar17 * fVar13 * fVar24) -
                fVar121 * fVar19 * fVar12 * fVar23)) - fVar129 * fVar16 * fVar13 * fVar24)) -
              fVar50 * fVar7 * fVar17 * fVar10 * fVar24) - fVar50 * fVar8 * fVar16 * fVar10 * fVar24
             )) - fVar129 * fVar17 * fVar14 * fVar24)) - fVar50 * fVar8 * fVar17 * fVar11 * fVar24)
          / ((fVar137 * fVar12 * fVar24 +
             ((fVar40 * fVar24 +
              ((fVar43 * fVar23 +
               ((fVar46 * fVar12 * fVar22 +
                ((fVar49 * fVar11 * fVar24 +
                 fVar558 * fVar12 * fVar22 +
                 ((fVar490 * fVar10 * fVar23 - fVar490 * fVar11 * fVar22) - fVar48 * fVar23)) -
                fVar39 * fVar24)) - fVar146 * fVar24)) - fVar45 * fVar11 * fVar24)) -
             fVar41 * fVar12 * fVar24)) - fVar38 * fVar24);
      fVar141 = fVar6 * fVar18;
      fVar48 = shouldBeZero1 * fVar4 * fVar18;
      fVar137 = shouldBeZero1 * fVar6;
      fVar50 = fVar137 * fVar16 * fVar11;
      fVar40 = shouldBeZero1 * fVar5 * fVar18;
      fVar490 = fVar137 * fVar17;
      fVar558 = fVar40 * fVar12;
      fVar46 = shouldBeZero2 * fVar4 * fVar18;
      fVar44 = shouldBeZero2 * fVar5 * fVar18;
      fVar146 = shouldBeZero2 * fVar6;
      fVar49 = fVar146 * fVar16;
      fVar45 = fVar146 * fVar17 * fVar11;
      fVar47 = fVar46 * fVar12;
      fVar41 = shouldBeZero1 * shouldBeZero1;
      fVar42 = fVar41 * fVar4 * fVar17;
      fVar135 = fVar41 * fVar5;
      fVar43 = fVar135 * fVar16 * fVar12;
      fVar315 = shouldBeZero2 * shouldBeZero2;
      fVar38 = fVar315 * fVar4;
      fVar121 = fVar38 * fVar17 * fVar12;
      fVar39 = fVar315 * fVar5 * fVar16;
      fVar136 = shouldBeZero1 * shouldBeZero2;
      fVar314 = fVar136 * fVar4;
      fVar129 = fVar136 * fVar5;
      b = -((fVar136 * fVar8 * fVar16 * fVar11 * fVar24 +
            fVar136 * fVar7 * fVar17 * fVar11 * fVar24 +
            fVar129 * fVar20 * fVar12 * fVar22 +
            (((fVar129 * fVar17 * fVar12 * fVar25 +
              fVar129 * fVar16 * fVar14 * fVar24 +
              (((fVar314 * fVar17 * fVar14 * fVar24 +
                ((fVar136 * fVar7 * fVar16 * fVar10 * fVar24 +
                 ((fVar314 * fVar16 * fVar13 * fVar24 +
                  (((fVar315 * fVar7 * fVar16 * fVar11 * fVar24 +
                    ((fVar38 * fVar20 * fVar12 * fVar22 +
                     ((fVar121 * fVar25 +
                      fVar38 * fVar16 * fVar14 * fVar24 +
                      ((fVar41 * fVar8 * fVar17 * fVar11 * fVar24 +
                       ((fVar135 * fVar17 * fVar14 * fVar24 +
                        ((fVar41 * fVar7 * fVar17 * fVar10 * fVar24 +
                         (((fVar42 * fVar13 * fVar24 +
                           shouldBeZero2 * fVar9 * fVar16 * fVar12 * fVar24 +
                           fVar49 * fVar15 * fVar24 +
                           (((shouldBeZero2 * fVar8 * fVar18 * fVar10 * fVar23 +
                             (((fVar146 * fVar19 * fVar11 * fVar23 +
                               ((fVar49 * fVar11 * fVar26 +
                                fVar44 * fVar13 * fVar23 +
                                ((shouldBeZero1 * fVar9 * fVar17 * fVar12 * fVar24 +
                                 fVar490 * fVar15 * fVar24 +
                                 ((((fVar137 * fVar20 * fVar11 * fVar23 +
                                    fVar490 * fVar11 * fVar26 +
                                    (((fVar137 * fVar19 * fVar11 * fVar22 +
                                      fVar50 * fVar25 +
                                      (((fVar6 * fVar21 * fVar11 * fVar24 +
                                        (fVar141 * fVar11 * fVar27 - fVar141 * fVar15 * fVar23)) -
                                       fVar9 * fVar18 * fVar12 * fVar23) - fVar48 * fVar13 * fVar23)
                                      ) - shouldBeZero1 * fVar7 * fVar18 * fVar10 * fVar23) -
                                    fVar40 * fVar14 * fVar23)) -
                                   shouldBeZero1 * fVar8 * fVar18 * fVar11 * fVar23) -
                                  fVar558 * fVar27) -
                                 shouldBeZero1 * fVar5 * fVar21 * fVar12 * fVar24)) -
                                fVar46 * fVar14 * fVar23)) - fVar45 * fVar25)) -
                              fVar146 * fVar20 * fVar11 * fVar22) -
                             shouldBeZero2 * fVar7 * fVar18 * fVar11 * fVar23)) - fVar47 * fVar27) -
                           shouldBeZero2 * fVar4 * fVar21 * fVar12 * fVar24)) - fVar43 * fVar25) -
                         fVar135 * fVar19 * fVar12 * fVar22)) - fVar135 * fVar17 * fVar12 * fVar26))
                       - fVar135 * fVar20 * fVar12 * fVar23)) - fVar38 * fVar16 * fVar12 * fVar26))
                     - fVar38 * fVar19 * fVar12 * fVar23)) - fVar39 * fVar13 * fVar24)) -
                   fVar315 * fVar8 * fVar16 * fVar10 * fVar24) - fVar314 * fVar16 * fVar12 * fVar25)
                  ) - fVar314 * fVar19 * fVar12 * fVar22)) - fVar314 * fVar17 * fVar12 * fVar26)) -
               fVar314 * fVar20 * fVar12 * fVar23) - fVar129 * fVar16 * fVar12 * fVar26)) -
             fVar129 * fVar17 * fVar13 * fVar24) - fVar129 * fVar19 * fVar12 * fVar23)) -
           fVar136 * fVar8 * fVar17 * fVar10 * fVar24) /
          ((fVar121 * fVar24 +
           ((fVar42 * fVar12 * fVar24 +
            ((fVar44 * fVar12 * fVar23 +
             ((fVar47 * fVar22 +
              ((fVar50 * fVar24 +
               fVar558 * fVar22 +
               ((fVar141 * fVar10 * fVar23 - fVar141 * fVar11 * fVar22) - fVar48 * fVar12 * fVar23))
              - fVar490 * fVar10 * fVar24)) - fVar49 * fVar10 * fVar24)) - fVar45 * fVar24)) -
           fVar43 * fVar24)) - fVar39 * fVar12 * fVar24);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator<<
                (&local_1738,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&numSolutions,
                 &shouldBeZero1);
      local_173c = -shouldBeZero2;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (&local_1738,&local_173c);
      local_1740 = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_1740);
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar37,&a)
      ;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&shouldBeZero2);
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&shouldBeZero1);
      local_1744 = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_1744);
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar37,&b)
      ;
      local_1748 = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_1748);
      local_174c = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_174c);
      local_1750 = 1.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_1750);
      local_1754 = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_1754);
      local_1758 = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_1758);
      local_175c = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_175c);
      local_1760 = 0.0;
      pCVar37 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar37,&local_1760);
      local_1764 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar37,&local_1764);
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_1738);
      local_1798 = (XprTypeNested)
                   Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                             ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_e38);
      PVar785 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)&local_1798
                           ,(MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&numSolutions);
      local_1790 = PVar785;
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
      ::operator*(&local_1780,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                   *)&local_1790,
                  (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                  (TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array + 0x22));
      Eigen::Matrix<float,4,4,0,4,4>::operator=
                ((Matrix<float,4,4,0,4,4> *)&numSolutions,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                  *)&local_1780);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&numSolutions);
      if ((tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1]._3_1_ & 1) != 0) {
        poVar29 = std::operator<<((ostream *)&std::cout,"[VERBOSE] The estimated ");
        poVar29 = (ostream *)std::ostream::operator<<(poVar29,local_1714 + 1);
        poVar29 = std::operator<<(poVar29," solution is:");
        poVar29 = (ostream *)
                  std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
        poVar29 = Eigen::operator<<(poVar29,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                            &numSolutions);
        std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
      }
    }
    iter._3_1_ = 1;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&sTheta1);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~vector((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               *)local_dd8);
    return __return_storage_ptr__;
  }
  poVar29 = std::operator<<((ostream *)&std::cerr,
                            "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
  std::ostream::operator<<(poVar29,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}